

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O2

void embree::avx512::CurveNiIntersectorK<8,16>::
     intersect_n<embree::avx512::OrientedCurve1IntersectorK<embree::BSplineCurveT,16>,embree::avx512::Intersect1KEpilog1<16,true>>
               (Precalculations *pre,RayHitK<16> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar1;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  uint uVar5;
  uint uVar6;
  uint uVar7;
  Geometry *pGVar8;
  RTCFilterFunctionN p_Var9;
  void *pvVar10;
  __int_type_conflict _Var11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  byte bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  bool bVar21;
  bool bVar22;
  undefined8 uVar23;
  undefined8 uVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [60];
  int iVar36;
  int iVar37;
  int iVar38;
  int iVar39;
  int iVar40;
  int iVar41;
  int iVar42;
  int iVar43;
  int iVar44;
  int iVar45;
  int iVar46;
  int iVar47;
  int iVar48;
  int iVar49;
  int iVar50;
  byte bVar51;
  uint uVar52;
  ulong uVar53;
  long lVar55;
  uint uVar56;
  ulong uVar57;
  ulong uVar58;
  ulong uVar59;
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined8 in_R10;
  bool bVar60;
  bool bVar61;
  bool bVar62;
  bool bVar63;
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [64];
  undefined1 auVar117 [64];
  undefined1 auVar119 [64];
  undefined1 auVar85 [16];
  undefined1 auVar121 [64];
  undefined1 auVar123 [64];
  undefined1 auVar125 [64];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar127 [64];
  undefined1 auVar128 [64];
  undefined1 auVar129 [64];
  float fVar130;
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  float fVar136;
  float fVar137;
  float fVar138;
  undefined1 auVar135 [64];
  float t1;
  undefined4 uVar139;
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  float fVar146;
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  float fVar154;
  float fVar162;
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  float fVar160;
  float fVar161;
  undefined1 in_ZMM4 [64];
  vfloat4 b0;
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [32];
  undefined1 auVar170 [32];
  undefined1 auVar171 [32];
  vfloat4 b0_1;
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [32];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [32];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [32];
  vfloat4 a0_2;
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [32];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [32];
  undefined1 auVar216 [32];
  undefined1 auVar217 [32];
  float fVar218;
  float fVar227;
  float fVar228;
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  float fVar229;
  float fVar240;
  float fVar241;
  vfloat4 a0_1;
  undefined1 auVar230 [16];
  float fVar242;
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  float fVar243;
  float fVar247;
  float fVar248;
  vfloat4 a0;
  float fVar249;
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  float fVar255;
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  undefined1 auVar261 [32];
  undefined1 auVar262 [64];
  undefined1 auVar263 [64];
  undefined1 auVar264 [64];
  undefined1 auVar265 [64];
  undefined1 auVar266 [64];
  undefined1 auVar267 [64];
  undefined1 auVar268 [64];
  undefined1 auVar269 [64];
  undefined1 auVar270 [64];
  undefined1 auVar271 [64];
  vfloat_impl<4> p02;
  vfloat_impl<4> p01;
  vfloat_impl<4> p00;
  RTCFilterFunctionNArguments args;
  uint mask_stack [4];
  vfloat_impl<4> p03;
  BBox1f cu_stack [4];
  vint<16> mask;
  BBox1f cv_stack [4];
  RTCFilterFunctionNArguments local_620;
  uint auStack_5f0 [4];
  undefined1 local_5e0 [8];
  float fStack_5d8;
  float fStack_5d4;
  undefined1 local_5d0 [16];
  undefined1 local_5c0 [16];
  undefined1 local_5b0 [16];
  undefined1 local_5a0 [8];
  float fStack_598;
  float fStack_594;
  undefined1 local_590 [8];
  float fStack_588;
  float fStack_584;
  undefined1 local_580 [16];
  undefined1 local_570 [16];
  undefined1 local_560 [8];
  float fStack_558;
  float fStack_554;
  undefined1 local_550 [16];
  undefined1 local_540 [8];
  float fStack_538;
  float fStack_534;
  undefined1 local_530 [16];
  undefined1 local_520 [16];
  undefined1 local_510 [16];
  undefined1 local_500 [16];
  undefined1 local_4f0 [16];
  undefined1 local_4e0 [16];
  undefined1 local_4d0 [16];
  undefined1 local_4c0 [16];
  undefined1 local_4b0 [16];
  undefined1 local_4a0 [16];
  undefined1 local_490 [8];
  float fStack_488;
  float fStack_484;
  undefined1 local_480 [16];
  undefined1 local_470 [16];
  undefined1 local_460 [32];
  undefined1 local_440 [32];
  undefined8 uStack_420;
  undefined1 local_400 [64];
  undefined1 local_3c0 [32];
  ulong auStack_3a0 [4];
  undefined1 local_380 [64];
  undefined1 local_340 [64];
  undefined1 local_300 [64];
  RTCHitN local_2c0 [64];
  undefined1 local_280 [64];
  undefined1 local_240 [64];
  undefined1 local_200 [64];
  undefined1 local_1c0 [64];
  undefined8 local_180;
  undefined8 uStack_178;
  undefined8 uStack_170;
  undefined8 uStack_168;
  undefined8 uStack_160;
  undefined8 uStack_158;
  undefined8 uStack_150;
  undefined8 uStack_148;
  undefined1 local_140 [64];
  undefined1 local_100 [64];
  undefined1 local_c0 [64];
  ulong uVar54;
  undefined1 auVar116 [64];
  undefined1 auVar118 [64];
  undefined1 auVar120 [64];
  undefined1 auVar122 [64];
  undefined1 auVar124 [64];
  undefined1 auVar126 [64];
  undefined1 auVar254 [32];
  
  uVar53 = (ulong)(byte)prim[1];
  fVar255 = *(float *)(prim + uVar53 * 0x19 + 0x12);
  auVar64 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          0x10);
  auVar64 = vinsertps_avx(auVar64,ZEXT416(*(uint *)(ray + k * 4 + 0x80)),0x20);
  auVar74 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x100)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0x140)),0x10);
  auVar66 = vinsertps_avx(auVar74,ZEXT416(*(uint *)(ray + k * 4 + 0x180)),0x20);
  auVar76 = vsubps_avx(auVar64,*(undefined1 (*) [16])(prim + uVar53 * 0x19 + 6));
  fVar146 = fVar255 * auVar76._0_4_;
  auVar64._8_8_ = 0;
  auVar64._0_8_ = *(ulong *)(prim + uVar53 * 4 + 6);
  auVar99 = vpmovsxbd_avx2(auVar64);
  fVar130 = fVar255 * auVar66._0_4_;
  auVar99 = vcvtdq2ps_avx(auVar99);
  auVar74._8_8_ = 0;
  auVar74._0_8_ = *(ulong *)(prim + uVar53 * 5 + 6);
  auVar97 = vpmovsxbd_avx2(auVar74);
  auVar97 = vcvtdq2ps_avx(auVar97);
  auVar3._8_8_ = 0;
  auVar3._0_8_ = *(ulong *)(prim + uVar53 * 6 + 6);
  auVar100 = vpmovsxbd_avx2(auVar3);
  auVar73._8_8_ = 0;
  auVar73._0_8_ = *(ulong *)(prim + uVar53 * 0xb + 6);
  auVar110 = vpmovsxbd_avx2(auVar73);
  auVar100 = vcvtdq2ps_avx(auVar100);
  auVar110 = vcvtdq2ps_avx(auVar110);
  auVar72._8_8_ = 0;
  auVar72._0_8_ = *(ulong *)(prim + uVar53 * 0xc + 6);
  auVar111 = vpmovsxbd_avx2(auVar72);
  auVar111 = vcvtdq2ps_avx(auVar111);
  auVar71._8_8_ = 0;
  auVar71._0_8_ = *(ulong *)(prim + uVar53 * 0xd + 6);
  auVar98 = vpmovsxbd_avx2(auVar71);
  auVar75._8_8_ = 0;
  auVar75._0_8_ = *(ulong *)(prim + uVar53 * 0x12 + 6);
  auVar101 = vpmovsxbd_avx2(auVar75);
  auVar98 = vcvtdq2ps_avx(auVar98);
  auVar101 = vcvtdq2ps_avx(auVar101);
  auVar70._8_8_ = 0;
  auVar70._0_8_ = *(ulong *)(prim + uVar53 * 0x13 + 6);
  auVar102 = vpmovsxbd_avx2(auVar70);
  auVar102 = vcvtdq2ps_avx(auVar102);
  auVar4._8_8_ = 0;
  auVar4._0_8_ = *(ulong *)(prim + uVar53 * 0x14 + 6);
  auVar104 = vpmovsxbd_avx2(auVar4);
  auVar103 = vcvtdq2ps_avx(auVar104);
  auVar261._8_4_ = 1;
  auVar261._0_8_ = 0x100000001;
  auVar261._12_4_ = 1;
  auVar261._16_4_ = 1;
  auVar261._20_4_ = 1;
  auVar261._24_4_ = 1;
  auVar261._28_4_ = 1;
  auVar158._4_4_ = fVar130;
  auVar158._0_4_ = fVar130;
  auVar158._8_4_ = fVar130;
  auVar158._12_4_ = fVar130;
  auVar158._16_4_ = fVar130;
  auVar158._20_4_ = fVar130;
  auVar158._24_4_ = fVar130;
  auVar158._28_4_ = fVar130;
  auVar96 = ZEXT1632(CONCAT412(fVar255 * auVar66._12_4_,
                               CONCAT48(fVar255 * auVar66._8_4_,
                                        CONCAT44(fVar255 * auVar66._4_4_,fVar130))));
  auVar105 = vpermps_avx2(auVar261,auVar96);
  auVar94 = vbroadcastss_avx512vl(ZEXT416(2));
  auVar268 = ZEXT3264(auVar94);
  auVar95 = vpermps_avx512vl(auVar94,auVar96);
  fVar130 = auVar95._0_4_;
  auVar135._0_4_ = fVar130 * auVar100._0_4_;
  fVar218 = auVar95._4_4_;
  auVar135._4_4_ = fVar218 * auVar100._4_4_;
  fVar227 = auVar95._8_4_;
  auVar135._8_4_ = fVar227 * auVar100._8_4_;
  fVar228 = auVar95._12_4_;
  auVar135._12_4_ = fVar228 * auVar100._12_4_;
  fVar136 = auVar95._16_4_;
  auVar135._16_4_ = fVar136 * auVar100._16_4_;
  fVar137 = auVar95._20_4_;
  auVar135._20_4_ = fVar137 * auVar100._20_4_;
  fVar138 = auVar95._24_4_;
  auVar135._28_36_ = in_ZMM4._28_36_;
  auVar135._24_4_ = fVar138 * auVar100._24_4_;
  auVar96._4_4_ = auVar98._4_4_ * fVar218;
  auVar96._0_4_ = auVar98._0_4_ * fVar130;
  auVar96._8_4_ = auVar98._8_4_ * fVar227;
  auVar96._12_4_ = auVar98._12_4_ * fVar228;
  auVar96._16_4_ = auVar98._16_4_ * fVar136;
  auVar96._20_4_ = auVar98._20_4_ * fVar137;
  auVar96._24_4_ = auVar98._24_4_ * fVar138;
  auVar96._28_4_ = auVar104._28_4_;
  auVar104._4_4_ = fVar218 * auVar103._4_4_;
  auVar104._0_4_ = fVar130 * auVar103._0_4_;
  auVar104._8_4_ = fVar227 * auVar103._8_4_;
  auVar104._12_4_ = fVar228 * auVar103._12_4_;
  auVar104._16_4_ = fVar136 * auVar103._16_4_;
  auVar104._20_4_ = fVar137 * auVar103._20_4_;
  auVar104._24_4_ = fVar138 * auVar103._24_4_;
  auVar104._28_4_ = auVar95._28_4_;
  auVar64 = vfmadd231ps_fma(auVar135._0_32_,auVar105,auVar97);
  auVar74 = vfmadd231ps_fma(auVar96,auVar105,auVar111);
  auVar3 = vfmadd231ps_fma(auVar104,auVar102,auVar105);
  auVar64 = vfmadd231ps_fma(ZEXT1632(auVar64),auVar158,auVar99);
  auVar74 = vfmadd231ps_fma(ZEXT1632(auVar74),auVar158,auVar110);
  auVar3 = vfmadd231ps_fma(ZEXT1632(auVar3),auVar101,auVar158);
  auVar169._4_4_ = fVar146;
  auVar169._0_4_ = fVar146;
  auVar169._8_4_ = fVar146;
  auVar169._12_4_ = fVar146;
  auVar169._16_4_ = fVar146;
  auVar169._20_4_ = fVar146;
  auVar169._24_4_ = fVar146;
  auVar169._28_4_ = fVar146;
  auVar105 = ZEXT1632(CONCAT412(fVar255 * auVar76._12_4_,
                                CONCAT48(fVar255 * auVar76._8_4_,
                                         CONCAT44(fVar255 * auVar76._4_4_,fVar146))));
  auVar104 = vpermps_avx2(auVar261,auVar105);
  auVar96 = vpermps_avx512vl(auVar94,auVar105);
  fVar255 = auVar96._0_4_;
  fVar130 = auVar96._4_4_;
  auVar105._4_4_ = fVar130 * auVar100._4_4_;
  auVar105._0_4_ = fVar255 * auVar100._0_4_;
  fVar218 = auVar96._8_4_;
  auVar105._8_4_ = fVar218 * auVar100._8_4_;
  fVar227 = auVar96._12_4_;
  auVar105._12_4_ = fVar227 * auVar100._12_4_;
  fVar228 = auVar96._16_4_;
  auVar105._16_4_ = fVar228 * auVar100._16_4_;
  fVar136 = auVar96._20_4_;
  auVar105._20_4_ = fVar136 * auVar100._20_4_;
  fVar137 = auVar96._24_4_;
  auVar105._24_4_ = fVar137 * auVar100._24_4_;
  auVar105._28_4_ = auVar100._28_4_;
  auVar108._0_4_ = fVar255 * auVar98._0_4_;
  auVar108._4_4_ = fVar130 * auVar98._4_4_;
  auVar108._8_4_ = fVar218 * auVar98._8_4_;
  auVar108._12_4_ = fVar227 * auVar98._12_4_;
  auVar108._16_4_ = fVar228 * auVar98._16_4_;
  auVar108._20_4_ = fVar136 * auVar98._20_4_;
  auVar108._24_4_ = fVar137 * auVar98._24_4_;
  auVar108._28_4_ = 0;
  auVar98._4_4_ = fVar130 * auVar103._4_4_;
  auVar98._0_4_ = fVar255 * auVar103._0_4_;
  auVar98._8_4_ = fVar218 * auVar103._8_4_;
  auVar98._12_4_ = fVar227 * auVar103._12_4_;
  auVar98._16_4_ = fVar228 * auVar103._16_4_;
  auVar98._20_4_ = fVar136 * auVar103._20_4_;
  auVar98._24_4_ = fVar137 * auVar103._24_4_;
  auVar98._28_4_ = auVar103._28_4_;
  auVar73 = vfmadd231ps_fma(auVar105,auVar104,auVar97);
  auVar72 = vfmadd231ps_fma(auVar108,auVar104,auVar111);
  auVar71 = vfmadd231ps_fma(auVar98,auVar104,auVar102);
  auVar73 = vfmadd231ps_fma(ZEXT1632(auVar73),auVar169,auVar99);
  auVar72 = vfmadd231ps_fma(ZEXT1632(auVar72),auVar169,auVar110);
  auVar71 = vfmadd231ps_fma(ZEXT1632(auVar71),auVar169,auVar101);
  auVar112._8_4_ = 0x7fffffff;
  auVar112._0_8_ = 0x7fffffff7fffffff;
  auVar112._12_4_ = 0x7fffffff;
  auVar112._16_4_ = 0x7fffffff;
  auVar112._20_4_ = 0x7fffffff;
  auVar112._24_4_ = 0x7fffffff;
  auVar112._28_4_ = 0x7fffffff;
  auVar113._8_4_ = 0x219392ef;
  auVar113._0_8_ = 0x219392ef219392ef;
  auVar113._12_4_ = 0x219392ef;
  auVar113._16_4_ = 0x219392ef;
  auVar113._20_4_ = 0x219392ef;
  auVar113._24_4_ = 0x219392ef;
  auVar113._28_4_ = 0x219392ef;
  auVar99 = vandps_avx(ZEXT1632(auVar64),auVar112);
  uVar58 = vcmpps_avx512vl(auVar99,auVar113,1);
  bVar62 = (bool)((byte)uVar58 & 1);
  auVar94._0_4_ = (uint)bVar62 * 0x219392ef | (uint)!bVar62 * auVar64._0_4_;
  bVar62 = (bool)((byte)(uVar58 >> 1) & 1);
  auVar94._4_4_ = (uint)bVar62 * 0x219392ef | (uint)!bVar62 * auVar64._4_4_;
  bVar62 = (bool)((byte)(uVar58 >> 2) & 1);
  auVar94._8_4_ = (uint)bVar62 * 0x219392ef | (uint)!bVar62 * auVar64._8_4_;
  bVar62 = (bool)((byte)(uVar58 >> 3) & 1);
  auVar94._12_4_ = (uint)bVar62 * 0x219392ef | (uint)!bVar62 * auVar64._12_4_;
  auVar94._16_4_ = (uint)((byte)(uVar58 >> 4) & 1) * 0x219392ef;
  auVar94._20_4_ = (uint)((byte)(uVar58 >> 5) & 1) * 0x219392ef;
  auVar94._24_4_ = (uint)((byte)(uVar58 >> 6) & 1) * 0x219392ef;
  auVar94._28_4_ = (uint)(byte)(uVar58 >> 7) * 0x219392ef;
  auVar99 = vandps_avx(ZEXT1632(auVar74),auVar112);
  uVar58 = vcmpps_avx512vl(auVar99,auVar113,1);
  bVar62 = (bool)((byte)uVar58 & 1);
  auVar95._0_4_ = (uint)bVar62 * 0x219392ef | (uint)!bVar62 * auVar74._0_4_;
  bVar62 = (bool)((byte)(uVar58 >> 1) & 1);
  auVar95._4_4_ = (uint)bVar62 * 0x219392ef | (uint)!bVar62 * auVar74._4_4_;
  bVar62 = (bool)((byte)(uVar58 >> 2) & 1);
  auVar95._8_4_ = (uint)bVar62 * 0x219392ef | (uint)!bVar62 * auVar74._8_4_;
  bVar62 = (bool)((byte)(uVar58 >> 3) & 1);
  auVar95._12_4_ = (uint)bVar62 * 0x219392ef | (uint)!bVar62 * auVar74._12_4_;
  auVar95._16_4_ = (uint)((byte)(uVar58 >> 4) & 1) * 0x219392ef;
  auVar95._20_4_ = (uint)((byte)(uVar58 >> 5) & 1) * 0x219392ef;
  auVar95._24_4_ = (uint)((byte)(uVar58 >> 6) & 1) * 0x219392ef;
  auVar95._28_4_ = (uint)(byte)(uVar58 >> 7) * 0x219392ef;
  auVar99 = vandps_avx(ZEXT1632(auVar3),auVar112);
  uVar58 = vcmpps_avx512vl(auVar99,auVar113,1);
  bVar62 = (bool)((byte)uVar58 & 1);
  auVar99._0_4_ = (uint)bVar62 * 0x219392ef | (uint)!bVar62 * auVar3._0_4_;
  bVar62 = (bool)((byte)(uVar58 >> 1) & 1);
  auVar99._4_4_ = (uint)bVar62 * 0x219392ef | (uint)!bVar62 * auVar3._4_4_;
  bVar62 = (bool)((byte)(uVar58 >> 2) & 1);
  auVar99._8_4_ = (uint)bVar62 * 0x219392ef | (uint)!bVar62 * auVar3._8_4_;
  bVar62 = (bool)((byte)(uVar58 >> 3) & 1);
  auVar99._12_4_ = (uint)bVar62 * 0x219392ef | (uint)!bVar62 * auVar3._12_4_;
  auVar99._16_4_ = (uint)((byte)(uVar58 >> 4) & 1) * 0x219392ef;
  auVar99._20_4_ = (uint)((byte)(uVar58 >> 5) & 1) * 0x219392ef;
  auVar99._24_4_ = (uint)((byte)(uVar58 >> 6) & 1) * 0x219392ef;
  auVar99._28_4_ = (uint)(byte)(uVar58 >> 7) * 0x219392ef;
  auVar97 = vrcp14ps_avx512vl(auVar94);
  auVar114._8_4_ = 0x3f800000;
  auVar114._0_8_ = 0x3f8000003f800000;
  auVar114._12_4_ = 0x3f800000;
  auVar114._16_4_ = 0x3f800000;
  auVar114._20_4_ = 0x3f800000;
  auVar114._24_4_ = 0x3f800000;
  auVar114._28_4_ = 0x3f800000;
  auVar64 = vfnmadd213ps_fma(auVar94,auVar97,auVar114);
  auVar64 = vfmadd132ps_fma(ZEXT1632(auVar64),auVar97,auVar97);
  auVar97 = vrcp14ps_avx512vl(auVar95);
  auVar74 = vfnmadd213ps_fma(auVar95,auVar97,auVar114);
  auVar74 = vfmadd132ps_fma(ZEXT1632(auVar74),auVar97,auVar97);
  auVar97 = vrcp14ps_avx512vl(auVar99);
  auVar3 = vfnmadd213ps_fma(auVar99,auVar97,auVar114);
  auVar3 = vfmadd132ps_fma(ZEXT1632(auVar3),auVar97,auVar97);
  auVar99 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar53 * 7 + 6));
  auVar99 = vcvtdq2ps_avx(auVar99);
  auVar99 = vsubps_avx(auVar99,ZEXT1632(auVar73));
  auVar101._4_4_ = auVar64._4_4_ * auVar99._4_4_;
  auVar101._0_4_ = auVar64._0_4_ * auVar99._0_4_;
  auVar101._8_4_ = auVar64._8_4_ * auVar99._8_4_;
  auVar101._12_4_ = auVar64._12_4_ * auVar99._12_4_;
  auVar101._16_4_ = auVar99._16_4_ * 0.0;
  auVar101._20_4_ = auVar99._20_4_ * 0.0;
  auVar101._24_4_ = auVar99._24_4_ * 0.0;
  auVar101._28_4_ = auVar99._28_4_;
  auVar99 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar53 * 9 + 6));
  auVar99 = vcvtdq2ps_avx(auVar99);
  auVar99 = vsubps_avx(auVar99,ZEXT1632(auVar73));
  auVar109._0_4_ = auVar64._0_4_ * auVar99._0_4_;
  auVar109._4_4_ = auVar64._4_4_ * auVar99._4_4_;
  auVar109._8_4_ = auVar64._8_4_ * auVar99._8_4_;
  auVar109._12_4_ = auVar64._12_4_ * auVar99._12_4_;
  auVar109._16_4_ = auVar99._16_4_ * 0.0;
  auVar109._20_4_ = auVar99._20_4_ * 0.0;
  auVar109._24_4_ = auVar99._24_4_ * 0.0;
  auVar109._28_4_ = 0;
  auVar99 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar53 * 0xe + 6));
  auVar99 = vcvtdq2ps_avx(auVar99);
  auVar99 = vsubps_avx(auVar99,ZEXT1632(auVar72));
  auVar102._4_4_ = auVar74._4_4_ * auVar99._4_4_;
  auVar102._0_4_ = auVar74._0_4_ * auVar99._0_4_;
  auVar102._8_4_ = auVar74._8_4_ * auVar99._8_4_;
  auVar102._12_4_ = auVar74._12_4_ * auVar99._12_4_;
  auVar102._16_4_ = auVar99._16_4_ * 0.0;
  auVar102._20_4_ = auVar99._20_4_ * 0.0;
  auVar102._24_4_ = auVar99._24_4_ * 0.0;
  auVar102._28_4_ = auVar99._28_4_;
  auVar98 = vpbroadcastd_avx512vl();
  auVar99 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + (ulong)(byte)prim[1] * 0x10 + 6));
  auVar99 = vcvtdq2ps_avx(auVar99);
  auVar99 = vsubps_avx(auVar99,ZEXT1632(auVar72));
  auVar97 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar53 * 0x15 + 6));
  auVar107._0_4_ = auVar74._0_4_ * auVar99._0_4_;
  auVar107._4_4_ = auVar74._4_4_ * auVar99._4_4_;
  auVar107._8_4_ = auVar74._8_4_ * auVar99._8_4_;
  auVar107._12_4_ = auVar74._12_4_ * auVar99._12_4_;
  auVar107._16_4_ = auVar99._16_4_ * 0.0;
  auVar107._20_4_ = auVar99._20_4_ * 0.0;
  auVar107._24_4_ = auVar99._24_4_ * 0.0;
  auVar107._28_4_ = 0;
  auVar99 = vcvtdq2ps_avx(auVar97);
  auVar99 = vsubps_avx(auVar99,ZEXT1632(auVar71));
  auVar103._4_4_ = auVar99._4_4_ * auVar3._4_4_;
  auVar103._0_4_ = auVar99._0_4_ * auVar3._0_4_;
  auVar103._8_4_ = auVar99._8_4_ * auVar3._8_4_;
  auVar103._12_4_ = auVar99._12_4_ * auVar3._12_4_;
  auVar103._16_4_ = auVar99._16_4_ * 0.0;
  auVar103._20_4_ = auVar99._20_4_ * 0.0;
  auVar103._24_4_ = auVar99._24_4_ * 0.0;
  auVar103._28_4_ = auVar99._28_4_;
  auVar99 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar53 * 0x17 + 6));
  auVar99 = vcvtdq2ps_avx(auVar99);
  auVar99 = vsubps_avx(auVar99,ZEXT1632(auVar71));
  auVar106._0_4_ = auVar3._0_4_ * auVar99._0_4_;
  auVar106._4_4_ = auVar3._4_4_ * auVar99._4_4_;
  auVar106._8_4_ = auVar3._8_4_ * auVar99._8_4_;
  auVar106._12_4_ = auVar3._12_4_ * auVar99._12_4_;
  auVar106._16_4_ = auVar99._16_4_ * 0.0;
  auVar106._20_4_ = auVar99._20_4_ * 0.0;
  auVar106._24_4_ = auVar99._24_4_ * 0.0;
  auVar106._28_4_ = 0;
  auVar99 = vpminsd_avx2(auVar101,auVar109);
  auVar97 = vpminsd_avx2(auVar102,auVar107);
  auVar99 = vmaxps_avx(auVar99,auVar97);
  auVar97 = vpminsd_avx2(auVar103,auVar106);
  uVar139 = *(undefined4 *)(ray + k * 4 + 0xc0);
  auVar100._4_4_ = uVar139;
  auVar100._0_4_ = uVar139;
  auVar100._8_4_ = uVar139;
  auVar100._12_4_ = uVar139;
  auVar100._16_4_ = uVar139;
  auVar100._20_4_ = uVar139;
  auVar100._24_4_ = uVar139;
  auVar100._28_4_ = uVar139;
  auVar97 = vmaxps_avx512vl(auVar97,auVar100);
  auVar99 = vmaxps_avx(auVar99,auVar97);
  auVar97._8_4_ = 0x3f7ffffa;
  auVar97._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar97._12_4_ = 0x3f7ffffa;
  auVar97._16_4_ = 0x3f7ffffa;
  auVar97._20_4_ = 0x3f7ffffa;
  auVar97._24_4_ = 0x3f7ffffa;
  auVar97._28_4_ = 0x3f7ffffa;
  local_3c0 = vmulps_avx512vl(auVar99,auVar97);
  auVar99 = vpmaxsd_avx2(auVar101,auVar109);
  auVar97 = vpmaxsd_avx2(auVar102,auVar107);
  auVar99 = vminps_avx(auVar99,auVar97);
  auVar97 = vpmaxsd_avx2(auVar103,auVar106);
  uVar139 = *(undefined4 *)(ray + k * 4 + 0x200);
  auVar110._4_4_ = uVar139;
  auVar110._0_4_ = uVar139;
  auVar110._8_4_ = uVar139;
  auVar110._12_4_ = uVar139;
  auVar110._16_4_ = uVar139;
  auVar110._20_4_ = uVar139;
  auVar110._24_4_ = uVar139;
  auVar110._28_4_ = uVar139;
  auVar97 = vminps_avx512vl(auVar97,auVar110);
  auVar99 = vminps_avx(auVar99,auVar97);
  auVar111._8_4_ = 0x3f800003;
  auVar111._0_8_ = 0x3f8000033f800003;
  auVar111._12_4_ = 0x3f800003;
  auVar111._16_4_ = 0x3f800003;
  auVar111._20_4_ = 0x3f800003;
  auVar111._24_4_ = 0x3f800003;
  auVar111._28_4_ = 0x3f800003;
  auVar99 = vmulps_avx512vl(auVar99,auVar111);
  uVar23 = vcmpps_avx512vl(local_3c0,auVar99,2);
  uVar24 = vpcmpgtd_avx512vl(auVar98,_DAT_01fb4ba0);
  uVar58 = CONCAT44((int)((ulong)in_R10 >> 0x20),(uint)(byte)((byte)uVar23 & (byte)uVar24));
  auVar135 = vpmovm2d_avx512dq((ulong)(uint)(1 << ((uint)k & 0x1f)));
  local_380 = vmovdqa64_avx512f(auVar135);
  auVar64 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
  auVar135 = ZEXT1664(auVar64);
  auVar64 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
  auVar262 = ZEXT1664(auVar64);
  auVar64 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
  auVar263 = ZEXT1664(auVar64);
  auVar271 = ZEXT464(0x3f800000);
LAB_019ff45f:
  if (uVar58 == 0) {
    return;
  }
  lVar55 = 0;
  for (uVar53 = uVar58; (uVar53 & 1) == 0; uVar53 = uVar53 >> 1 | 0x8000000000000000) {
    lVar55 = lVar55 + 1;
  }
  uVar5 = *(uint *)(prim + 2);
  uVar6 = *(uint *)(prim + lVar55 * 4 + 6);
  pGVar8 = (context->scene->geometries).items[uVar5].ptr;
  uVar53 = (ulong)*(uint *)(*(long *)&pGVar8->field_0x58 +
                           pGVar8[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i * (ulong)uVar6);
  p_Var9 = pGVar8[1].intersectionFilterN;
  pvVar10 = pGVar8[2].userPtr;
  _Var11 = pGVar8[2].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  auVar64 = *(undefined1 (*) [16])(_Var11 + uVar53 * (long)pvVar10);
  auVar74 = *(undefined1 (*) [16])(_Var11 + (uVar53 + 1) * (long)pvVar10);
  auVar3 = *(undefined1 (*) [16])(_Var11 + (uVar53 + 2) * (long)pvVar10);
  auVar73 = *(undefined1 (*) [16])(_Var11 + (long)pvVar10 * (uVar53 + 3));
  lVar55 = *(long *)&pGVar8[1].time_range.upper;
  auVar72 = *(undefined1 (*) [16])(lVar55 + (long)p_Var9 * uVar53);
  auVar71 = *(undefined1 (*) [16])(lVar55 + (long)p_Var9 * (uVar53 + 1));
  auVar75 = *(undefined1 (*) [16])(lVar55 + (long)p_Var9 * (uVar53 + 2));
  uVar58 = uVar58 - 1 & uVar58;
  auVar70 = *(undefined1 (*) [16])(lVar55 + (long)p_Var9 * (uVar53 + 3));
  if (uVar58 != 0) {
    uVar59 = uVar58 - 1 & uVar58;
    for (uVar53 = uVar58; (uVar53 & 1) == 0; uVar53 = uVar53 >> 1 | 0x8000000000000000) {
    }
    if (uVar59 != 0) {
      for (; (uVar59 & 1) == 0; uVar59 = uVar59 >> 1 | 0x8000000000000000) {
      }
    }
  }
  auVar4 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x1c
                        );
  auVar4 = vinsertps_avx(auVar4,ZEXT416(*(uint *)(ray + k * 4 + 0x80)),0x28);
  fVar255 = *(float *)(ray + k * 4 + 0xc0);
  auVar80 = ZEXT816(0) << 0x40;
  auVar68._0_4_ = auVar70._0_4_ * 0.0;
  auVar68._4_4_ = auVar70._4_4_ * 0.0;
  auVar68._8_4_ = auVar70._8_4_ * 0.0;
  auVar68._12_4_ = auVar70._12_4_ * 0.0;
  auVar250._8_4_ = 0x3e2aaaab;
  auVar250._0_8_ = 0x3e2aaaab3e2aaaab;
  auVar250._12_4_ = 0x3e2aaaab;
  auVar66 = vfmadd213ps_fma(auVar250,auVar75,auVar68);
  auVar65 = vbroadcastss_avx512vl(ZEXT416(0x3f2aaaab));
  auVar66 = vfmadd231ps_avx512vl(auVar66,auVar71,auVar65);
  auVar76 = vfmadd231ps_fma(auVar66,auVar72,auVar250);
  auVar77 = auVar135._0_16_;
  auVar66 = vfmadd231ps_avx512vl(auVar68,auVar75,auVar77);
  auVar66 = vfnmadd231ps_fma(auVar66,auVar71,auVar80);
  auVar67 = vfnmadd231ps_avx512vl(auVar66,auVar72,auVar77);
  auVar230._0_4_ = auVar73._0_4_ * 0.0;
  auVar230._4_4_ = auVar73._4_4_ * 0.0;
  auVar230._8_4_ = auVar73._8_4_ * 0.0;
  auVar230._12_4_ = auVar73._12_4_ * 0.0;
  auVar66 = vfmadd213ps_fma(auVar250,auVar3,auVar230);
  auVar66 = vfmadd231ps_avx512vl(auVar66,auVar74,auVar65);
  auVar66 = vfmadd231ps_fma(auVar66,auVar64,auVar250);
  auVar68 = vfmadd231ps_avx512vl(auVar230,auVar3,auVar77);
  auVar68 = vfnmadd231ps_fma(auVar68,auVar74,auVar80);
  auVar69 = vfnmadd231ps_avx512vl(auVar68,auVar64,auVar77);
  auVar79._0_4_ = auVar70._0_4_ * 0.16666667;
  auVar79._4_4_ = auVar70._4_4_ * 0.16666667;
  auVar79._8_4_ = auVar70._8_4_ * 0.16666667;
  auVar79._12_4_ = auVar70._12_4_ * 0.16666667;
  auVar68 = vfmadd231ps_avx512vl(auVar79,auVar75,auVar65);
  auVar68 = vfmadd231ps_fma(auVar68,auVar71,auVar250);
  auVar68 = vfmadd231ps_fma(auVar68,auVar72,auVar80);
  auVar70 = vmulps_avx512vl(auVar70,auVar77);
  auVar75 = vfmadd231ps_fma(auVar70,auVar80,auVar75);
  auVar71 = vfnmadd231ps_avx512vl(auVar75,auVar77,auVar71);
  auVar75 = vfnmadd231ps_fma(auVar71,auVar80,auVar72);
  auVar199._0_4_ = auVar73._0_4_ * 0.16666667;
  auVar199._4_4_ = auVar73._4_4_ * 0.16666667;
  auVar199._8_4_ = auVar73._8_4_ * 0.16666667;
  auVar199._12_4_ = auVar73._12_4_ * 0.16666667;
  auVar72 = vfmadd231ps_avx512vl(auVar199,auVar3,auVar65);
  auVar72 = vfmadd231ps_fma(auVar72,auVar74,auVar250);
  auVar72 = vfmadd231ps_fma(auVar72,auVar64,auVar80);
  auVar73 = vmulps_avx512vl(auVar73,auVar77);
  auVar3 = vfmadd231ps_fma(auVar73,auVar80,auVar3);
  auVar74 = vfnmadd231ps_avx512vl(auVar3,auVar77,auVar74);
  auVar71 = vfnmadd231ps_fma(auVar74,auVar80,auVar64);
  auVar64 = vshufps_avx(auVar67,auVar67,0xc9);
  auVar74 = vshufps_avx(auVar66,auVar66,0xc9);
  fVar136 = auVar67._0_4_;
  auVar86._0_4_ = fVar136 * auVar74._0_4_;
  fVar137 = auVar67._4_4_;
  auVar86._4_4_ = fVar137 * auVar74._4_4_;
  fVar138 = auVar67._8_4_;
  auVar86._8_4_ = fVar138 * auVar74._8_4_;
  fVar146 = auVar67._12_4_;
  auVar86._12_4_ = fVar146 * auVar74._12_4_;
  auVar74 = vfmsub231ps_fma(auVar86,auVar64,auVar66);
  auVar3 = vshufps_avx(auVar74,auVar74,0xc9);
  auVar74 = vshufps_avx(auVar69,auVar69,0xc9);
  auVar92._0_4_ = fVar136 * auVar74._0_4_;
  auVar92._4_4_ = fVar137 * auVar74._4_4_;
  auVar92._8_4_ = fVar138 * auVar74._8_4_;
  auVar92._12_4_ = fVar146 * auVar74._12_4_;
  auVar64 = vfmsub231ps_fma(auVar92,auVar64,auVar69);
  auVar73 = vshufps_avx(auVar64,auVar64,0xc9);
  auVar64 = vshufps_avx(auVar75,auVar75,0xc9);
  auVar74 = vshufps_avx(auVar72,auVar72,0xc9);
  fVar154 = auVar75._0_4_;
  auVar87._0_4_ = fVar154 * auVar74._0_4_;
  fVar160 = auVar75._4_4_;
  auVar87._4_4_ = fVar160 * auVar74._4_4_;
  fVar161 = auVar75._8_4_;
  auVar87._8_4_ = fVar161 * auVar74._8_4_;
  fVar162 = auVar75._12_4_;
  auVar87._12_4_ = fVar162 * auVar74._12_4_;
  auVar74 = vfmsub231ps_fma(auVar87,auVar64,auVar72);
  auVar72 = vshufps_avx(auVar74,auVar74,0xc9);
  auVar74 = vshufps_avx(auVar71,auVar71,0xc9);
  auVar200._0_4_ = auVar74._0_4_ * fVar154;
  auVar200._4_4_ = auVar74._4_4_ * fVar160;
  auVar200._8_4_ = auVar74._8_4_ * fVar161;
  auVar200._12_4_ = auVar74._12_4_ * fVar162;
  auVar74 = vfmsub231ps_fma(auVar200,auVar64,auVar71);
  auVar64 = vdpps_avx(auVar3,auVar3,0x7f);
  auVar71 = vshufps_avx(auVar74,auVar74,0xc9);
  fVar218 = auVar64._0_4_;
  auVar201._4_12_ = ZEXT812(0) << 0x20;
  auVar201._0_4_ = fVar218;
  auVar74 = vrsqrt14ss_avx512f(auVar80,auVar201);
  auVar70 = vmulss_avx512f(auVar74,ZEXT416(0x3fc00000));
  auVar66 = vmulss_avx512f(auVar64,ZEXT416(0xbf000000));
  fVar130 = auVar74._0_4_;
  auVar74 = vdpps_avx(auVar3,auVar73,0x7f);
  fVar130 = auVar70._0_4_ + auVar66._0_4_ * fVar130 * fVar130 * fVar130;
  fVar229 = fVar130 * auVar3._0_4_;
  fVar240 = fVar130 * auVar3._4_4_;
  fVar241 = fVar130 * auVar3._8_4_;
  fVar242 = fVar130 * auVar3._12_4_;
  auVar211._0_4_ = auVar73._0_4_ * fVar218;
  auVar211._4_4_ = auVar73._4_4_ * fVar218;
  auVar211._8_4_ = auVar73._8_4_ * fVar218;
  auVar211._12_4_ = auVar73._12_4_ * fVar218;
  fVar218 = auVar74._0_4_;
  auVar179._0_4_ = fVar218 * auVar3._0_4_;
  auVar179._4_4_ = fVar218 * auVar3._4_4_;
  auVar179._8_4_ = fVar218 * auVar3._8_4_;
  auVar179._12_4_ = fVar218 * auVar3._12_4_;
  auVar3 = vsubps_avx(auVar211,auVar179);
  auVar74 = vrcp14ss_avx512f(auVar80,auVar201);
  auVar64 = vfnmadd213ss_avx512f(auVar64,auVar74,ZEXT416(0x40000000));
  fVar227 = auVar74._0_4_ * auVar64._0_4_;
  auVar64 = vdpps_avx(auVar72,auVar72,0x7f);
  fVar228 = auVar64._0_4_;
  auVar202._4_12_ = ZEXT812(0) << 0x20;
  auVar202._0_4_ = fVar228;
  auVar74 = vrsqrt14ss_avx512f(auVar80,auVar202);
  auVar73 = vmulss_avx512f(auVar74,ZEXT416(0x3fc00000));
  auVar70 = vmulss_avx512f(auVar64,ZEXT416(0xbf000000));
  fVar218 = auVar74._0_4_;
  fVar218 = auVar73._0_4_ + auVar70._0_4_ * fVar218 * fVar218 * fVar218;
  auVar74 = vdpps_avx(auVar72,auVar71,0x7f);
  fVar243 = fVar218 * auVar72._0_4_;
  fVar247 = fVar218 * auVar72._4_4_;
  fVar248 = fVar218 * auVar72._8_4_;
  fVar249 = fVar218 * auVar72._12_4_;
  auVar81._0_4_ = fVar228 * auVar71._0_4_;
  auVar81._4_4_ = fVar228 * auVar71._4_4_;
  auVar81._8_4_ = fVar228 * auVar71._8_4_;
  auVar81._12_4_ = fVar228 * auVar71._12_4_;
  fVar228 = auVar74._0_4_;
  auVar85._0_4_ = fVar228 * auVar72._0_4_;
  auVar85._4_4_ = fVar228 * auVar72._4_4_;
  auVar85._8_4_ = fVar228 * auVar72._8_4_;
  auVar85._12_4_ = fVar228 * auVar72._12_4_;
  auVar73 = vsubps_avx(auVar81,auVar85);
  auVar74 = vrcp14ss_avx512f(auVar80,auVar202);
  auVar64 = vfnmadd213ss_avx512f(auVar64,auVar74,ZEXT416(0x40000000));
  fVar228 = auVar64._0_4_ * auVar74._0_4_;
  auVar64 = vshufps_avx(auVar76,auVar76,0xff);
  auVar186._0_4_ = fVar229 * auVar64._0_4_;
  auVar186._4_4_ = fVar240 * auVar64._4_4_;
  auVar186._8_4_ = fVar241 * auVar64._8_4_;
  auVar186._12_4_ = fVar242 * auVar64._12_4_;
  local_530 = vsubps_avx(auVar76,auVar186);
  auVar74 = vshufps_avx(auVar67,auVar67,0xff);
  auVar82._0_4_ = auVar74._0_4_ * fVar229 + auVar64._0_4_ * fVar130 * fVar227 * auVar3._0_4_;
  auVar82._4_4_ = auVar74._4_4_ * fVar240 + auVar64._4_4_ * fVar130 * fVar227 * auVar3._4_4_;
  auVar82._8_4_ = auVar74._8_4_ * fVar241 + auVar64._8_4_ * fVar130 * fVar227 * auVar3._8_4_;
  auVar82._12_4_ = auVar74._12_4_ * fVar242 + auVar64._12_4_ * fVar130 * fVar227 * auVar3._12_4_;
  auVar3 = vsubps_avx(auVar67,auVar82);
  local_540._0_4_ = auVar186._0_4_ + auVar76._0_4_;
  local_540._4_4_ = auVar186._4_4_ + auVar76._4_4_;
  fStack_538 = auVar186._8_4_ + auVar76._8_4_;
  fStack_534 = auVar186._12_4_ + auVar76._12_4_;
  auVar64 = vshufps_avx(auVar68,auVar68,0xff);
  auVar88._0_4_ = fVar243 * auVar64._0_4_;
  auVar88._4_4_ = fVar247 * auVar64._4_4_;
  auVar88._8_4_ = fVar248 * auVar64._8_4_;
  auVar88._12_4_ = fVar249 * auVar64._12_4_;
  local_550 = vsubps_avx512vl(auVar68,auVar88);
  auVar74 = vshufps_avx(auVar75,auVar75,0xff);
  auVar80._0_4_ = auVar74._0_4_ * fVar243 + auVar64._0_4_ * fVar218 * auVar73._0_4_ * fVar228;
  auVar80._4_4_ = auVar74._4_4_ * fVar247 + auVar64._4_4_ * fVar218 * auVar73._4_4_ * fVar228;
  auVar80._8_4_ = auVar74._8_4_ * fVar248 + auVar64._8_4_ * fVar218 * auVar73._8_4_ * fVar228;
  auVar80._12_4_ = auVar74._12_4_ * fVar249 + auVar64._12_4_ * fVar218 * auVar73._12_4_ * fVar228;
  auVar64 = vsubps_avx(auVar75,auVar80);
  local_560._0_4_ = auVar68._0_4_ + auVar88._0_4_;
  local_560._4_4_ = auVar68._4_4_ + auVar88._4_4_;
  fStack_558 = auVar68._8_4_ + auVar88._8_4_;
  fStack_554 = auVar68._12_4_ + auVar88._12_4_;
  auVar89._0_4_ = auVar3._0_4_ * 0.33333334;
  auVar89._4_4_ = auVar3._4_4_ * 0.33333334;
  auVar89._8_4_ = auVar3._8_4_ * 0.33333334;
  auVar89._12_4_ = auVar3._12_4_ * 0.33333334;
  local_570 = vaddps_avx512vl(local_530,auVar89);
  auVar93._0_4_ = auVar64._0_4_ * 0.33333334;
  auVar93._4_4_ = auVar64._4_4_ * 0.33333334;
  auVar93._8_4_ = auVar64._8_4_ * 0.33333334;
  auVar93._12_4_ = auVar64._12_4_ * 0.33333334;
  local_580 = vsubps_avx512vl(local_550,auVar93);
  auVar76._0_4_ = (fVar136 + auVar82._0_4_) * 0.33333334;
  auVar76._4_4_ = (fVar137 + auVar82._4_4_) * 0.33333334;
  auVar76._8_4_ = (fVar138 + auVar82._8_4_) * 0.33333334;
  auVar76._12_4_ = (fVar146 + auVar82._12_4_) * 0.33333334;
  _local_590 = vaddps_avx512vl(_local_540,auVar76);
  auVar65._0_4_ = (fVar154 + auVar80._0_4_) * 0.33333334;
  auVar65._4_4_ = (fVar160 + auVar80._4_4_) * 0.33333334;
  auVar65._8_4_ = (fVar161 + auVar80._8_4_) * 0.33333334;
  auVar65._12_4_ = (fVar162 + auVar80._12_4_) * 0.33333334;
  _local_5a0 = vsubps_avx512vl(_local_560,auVar65);
  local_4b0 = vsubps_avx(local_530,auVar4);
  uVar139 = local_4b0._0_4_;
  auVar77._4_4_ = uVar139;
  auVar77._0_4_ = uVar139;
  auVar77._8_4_ = uVar139;
  auVar77._12_4_ = uVar139;
  auVar64 = vshufps_avx(local_4b0,local_4b0,0x55);
  aVar1 = pre->ray_space[k].vx.field_0;
  aVar2 = pre->ray_space[k].vy.field_0;
  auVar74 = vshufps_avx(local_4b0,local_4b0,0xaa);
  fVar130 = pre->ray_space[k].vz.field_0.m128[0];
  fVar218 = pre->ray_space[k].vz.field_0.m128[1];
  fVar227 = pre->ray_space[k].vz.field_0.m128[2];
  fVar228 = pre->ray_space[k].vz.field_0.m128[3];
  auVar67._0_4_ = fVar130 * auVar74._0_4_;
  auVar67._4_4_ = fVar218 * auVar74._4_4_;
  auVar67._8_4_ = fVar227 * auVar74._8_4_;
  auVar67._12_4_ = fVar228 * auVar74._12_4_;
  auVar64 = vfmadd231ps_fma(auVar67,(undefined1  [16])aVar2,auVar64);
  auVar75 = vfmadd231ps_fma(auVar64,(undefined1  [16])aVar1,auVar77);
  local_4c0 = vsubps_avx512vl(local_570,auVar4);
  uVar139 = local_4c0._0_4_;
  auVar83._4_4_ = uVar139;
  auVar83._0_4_ = uVar139;
  auVar83._8_4_ = uVar139;
  auVar83._12_4_ = uVar139;
  auVar64 = vshufps_avx(local_4c0,local_4c0,0x55);
  auVar74 = vshufps_avx(local_4c0,local_4c0,0xaa);
  auVar78._0_4_ = fVar130 * auVar74._0_4_;
  auVar78._4_4_ = fVar218 * auVar74._4_4_;
  auVar78._8_4_ = fVar227 * auVar74._8_4_;
  auVar78._12_4_ = fVar228 * auVar74._12_4_;
  auVar64 = vfmadd231ps_fma(auVar78,(undefined1  [16])aVar2,auVar64);
  auVar70 = vfmadd231ps_fma(auVar64,(undefined1  [16])aVar1,auVar83);
  local_4d0 = vsubps_avx512vl(local_580,auVar4);
  uVar139 = local_4d0._0_4_;
  auVar90._4_4_ = uVar139;
  auVar90._0_4_ = uVar139;
  auVar90._8_4_ = uVar139;
  auVar90._12_4_ = uVar139;
  auVar64 = vshufps_avx(local_4d0,local_4d0,0x55);
  auVar74 = vshufps_avx(local_4d0,local_4d0,0xaa);
  auVar84._0_4_ = fVar130 * auVar74._0_4_;
  auVar84._4_4_ = fVar218 * auVar74._4_4_;
  auVar84._8_4_ = fVar227 * auVar74._8_4_;
  auVar84._12_4_ = fVar228 * auVar74._12_4_;
  auVar64 = vfmadd231ps_fma(auVar84,(undefined1  [16])aVar2,auVar64);
  auVar66 = vfmadd231ps_fma(auVar64,(undefined1  [16])aVar1,auVar90);
  local_4e0 = vsubps_avx512vl(local_550,auVar4);
  uVar139 = local_4e0._0_4_;
  auVar187._4_4_ = uVar139;
  auVar187._0_4_ = uVar139;
  auVar187._8_4_ = uVar139;
  auVar187._12_4_ = uVar139;
  auVar64 = vshufps_avx(local_4e0,local_4e0,0x55);
  auVar74 = vshufps_avx(local_4e0,local_4e0,0xaa);
  auVar91._0_4_ = fVar130 * auVar74._0_4_;
  auVar91._4_4_ = fVar218 * auVar74._4_4_;
  auVar91._8_4_ = fVar227 * auVar74._8_4_;
  auVar91._12_4_ = fVar228 * auVar74._12_4_;
  auVar64 = vfmadd231ps_fma(auVar91,(undefined1  [16])aVar2,auVar64);
  auVar76 = vfmadd231ps_fma(auVar64,(undefined1  [16])aVar1,auVar187);
  local_4f0 = vsubps_avx(_local_540,auVar4);
  uVar139 = local_4f0._0_4_;
  auVar188._4_4_ = uVar139;
  auVar188._0_4_ = uVar139;
  auVar188._8_4_ = uVar139;
  auVar188._12_4_ = uVar139;
  auVar64 = vshufps_avx(local_4f0,local_4f0,0x55);
  auVar74 = vshufps_avx(local_4f0,local_4f0,0xaa);
  auVar212._0_4_ = auVar74._0_4_ * fVar130;
  auVar212._4_4_ = auVar74._4_4_ * fVar218;
  auVar212._8_4_ = auVar74._8_4_ * fVar227;
  auVar212._12_4_ = auVar74._12_4_ * fVar228;
  auVar64 = vfmadd231ps_fma(auVar212,(undefined1  [16])aVar2,auVar64);
  auVar68 = vfmadd231ps_fma(auVar64,(undefined1  [16])aVar1,auVar188);
  local_500 = vsubps_avx512vl(_local_590,auVar4);
  uVar139 = local_500._0_4_;
  auVar189._4_4_ = uVar139;
  auVar189._0_4_ = uVar139;
  auVar189._8_4_ = uVar139;
  auVar189._12_4_ = uVar139;
  auVar64 = vshufps_avx(local_500,local_500,0x55);
  auVar74 = vshufps_avx(local_500,local_500,0xaa);
  auVar219._0_4_ = auVar74._0_4_ * fVar130;
  auVar219._4_4_ = auVar74._4_4_ * fVar218;
  auVar219._8_4_ = auVar74._8_4_ * fVar227;
  auVar219._12_4_ = auVar74._12_4_ * fVar228;
  auVar64 = vfmadd231ps_fma(auVar219,(undefined1  [16])aVar2,auVar64);
  auVar65 = vfmadd231ps_fma(auVar64,(undefined1  [16])aVar1,auVar189);
  local_510 = vsubps_avx512vl(_local_5a0,auVar4);
  uVar139 = local_510._0_4_;
  auVar190._4_4_ = uVar139;
  auVar190._0_4_ = uVar139;
  auVar190._8_4_ = uVar139;
  auVar190._12_4_ = uVar139;
  auVar64 = vshufps_avx(local_510,local_510,0x55);
  auVar74 = vshufps_avx(local_510,local_510,0xaa);
  auVar231._0_4_ = auVar74._0_4_ * fVar130;
  auVar231._4_4_ = auVar74._4_4_ * fVar218;
  auVar231._8_4_ = auVar74._8_4_ * fVar227;
  auVar231._12_4_ = auVar74._12_4_ * fVar228;
  auVar64 = vfmadd231ps_fma(auVar231,(undefined1  [16])aVar2,auVar64);
  auVar67 = vfmadd231ps_fma(auVar64,(undefined1  [16])aVar1,auVar190);
  local_520 = vsubps_avx(_local_560,auVar4);
  uVar139 = local_520._0_4_;
  auVar69._4_4_ = uVar139;
  auVar69._0_4_ = uVar139;
  auVar69._8_4_ = uVar139;
  auVar69._12_4_ = uVar139;
  auVar64 = vshufps_avx(local_520,local_520,0x55);
  auVar74 = vshufps_avx(local_520,local_520,0xaa);
  auVar180._0_4_ = auVar74._0_4_ * fVar130;
  auVar180._4_4_ = auVar74._4_4_ * fVar218;
  auVar180._8_4_ = auVar74._8_4_ * fVar227;
  auVar180._12_4_ = auVar74._12_4_ * fVar228;
  auVar64 = vfmadd231ps_fma(auVar180,(undefined1  [16])aVar2,auVar64);
  auVar4 = vfmadd231ps_fma(auVar64,(undefined1  [16])aVar1,auVar69);
  auVar3 = vmovlhps_avx(auVar75,auVar68);
  auVar73 = vmovlhps_avx(auVar70,auVar65);
  auVar71 = vmovlhps_avx512f(auVar66,auVar67);
  _local_490 = vmovlhps_avx512f(auVar76,auVar4);
  auVar74 = vminps_avx(auVar3,auVar73);
  auVar64 = vmaxps_avx(auVar3,auVar73);
  auVar72 = vminps_avx512vl(auVar71,_local_490);
  auVar74 = vminps_avx(auVar74,auVar72);
  auVar72 = vmaxps_avx512vl(auVar71,_local_490);
  auVar64 = vmaxps_avx(auVar64,auVar72);
  auVar72 = vshufpd_avx(auVar74,auVar74,3);
  auVar74 = vminps_avx(auVar74,auVar72);
  auVar72 = vshufpd_avx(auVar64,auVar64,3);
  auVar64 = vmaxps_avx(auVar64,auVar72);
  auVar74 = vandps_avx512vl(auVar74,auVar262._0_16_);
  auVar64 = vandps_avx512vl(auVar64,auVar262._0_16_);
  auVar64 = vmaxps_avx(auVar74,auVar64);
  auVar74 = vmovshdup_avx(auVar64);
  auVar64 = vmaxss_avx(auVar74,auVar64);
  auVar72 = vmovddup_avx512vl(auVar75);
  auVar75 = vmovddup_avx512vl(auVar70);
  auVar70 = vmovddup_avx512vl(auVar66);
  auVar76 = vmovddup_avx512vl(auVar76);
  local_4a0 = ZEXT416((uint)(auVar64._0_4_ * 9.536743e-07));
  local_440 = vbroadcastss_avx512vl(local_4a0);
  auVar64 = vxorps_avx512vl(local_440._0_16_,auVar263._0_16_);
  local_460 = vbroadcastss_avx512vl(auVar64);
  uVar53 = 0;
  auVar64 = vsubps_avx(auVar73,auVar3);
  local_470 = vsubps_avx512vl(auVar71,auVar73);
  local_480 = vsubps_avx512vl(_local_490,auVar71);
  local_5b0 = vsubps_avx(_local_540,local_530);
  local_5c0 = vsubps_avx512vl(_local_590,local_570);
  local_5d0 = vsubps_avx512vl(_local_5a0,local_580);
  _local_5e0 = vsubps_avx512vl(_local_560,local_550);
  auVar135 = vpbroadcastd_avx512f();
  local_300 = vmovdqa64_avx512f(auVar135);
  auVar135 = vpbroadcastd_avx512f();
  local_340 = vmovdqa64_avx512f(auVar135);
  auVar74 = ZEXT816(0x3f80000000000000);
  auVar127._32_32_ = auVar135._32_32_;
  auVar66 = auVar74;
LAB_019ffbdb:
  do {
    auVar270 = ZEXT3264(local_440);
    auVar269 = ZEXT1664(auVar76);
    auVar69 = vshufps_avx(auVar66,auVar66,0x50);
    auVar251._8_4_ = 0x3f800000;
    auVar251._0_8_ = 0x3f8000003f800000;
    auVar251._12_4_ = 0x3f800000;
    auVar254._16_4_ = 0x3f800000;
    auVar254._0_16_ = auVar251;
    auVar254._20_4_ = 0x3f800000;
    auVar254._24_4_ = 0x3f800000;
    auVar254._28_4_ = 0x3f800000;
    auVar80 = vsubps_avx(auVar251,auVar69);
    fVar130 = auVar69._0_4_;
    fVar136 = auVar68._0_4_;
    auVar155._0_4_ = fVar136 * fVar130;
    fVar218 = auVar69._4_4_;
    fVar137 = auVar68._4_4_;
    auVar155._4_4_ = fVar137 * fVar218;
    fVar227 = auVar69._8_4_;
    auVar155._8_4_ = fVar136 * fVar227;
    fVar228 = auVar69._12_4_;
    auVar155._12_4_ = fVar137 * fVar228;
    fVar138 = auVar65._0_4_;
    auVar163._0_4_ = fVar138 * fVar130;
    fVar146 = auVar65._4_4_;
    auVar163._4_4_ = fVar146 * fVar218;
    auVar163._8_4_ = fVar138 * fVar227;
    auVar163._12_4_ = fVar146 * fVar228;
    fVar154 = auVar67._0_4_;
    auVar172._0_4_ = fVar154 * fVar130;
    fVar160 = auVar67._4_4_;
    auVar172._4_4_ = fVar160 * fVar218;
    auVar172._8_4_ = fVar154 * fVar227;
    auVar172._12_4_ = fVar160 * fVar228;
    fVar161 = auVar4._0_4_;
    auVar141._0_4_ = fVar161 * fVar130;
    fVar162 = auVar4._4_4_;
    auVar141._4_4_ = fVar162 * fVar218;
    auVar141._8_4_ = fVar161 * fVar227;
    auVar141._12_4_ = fVar162 * fVar228;
    auVar77 = vfmadd231ps_avx512vl(auVar155,auVar80,auVar72);
    auVar78 = vfmadd231ps_avx512vl(auVar163,auVar80,auVar75);
    auVar79 = vfmadd231ps_avx512vl(auVar172,auVar80,auVar70);
    auVar80 = vfmadd231ps_avx512vl(auVar141,auVar76,auVar80);
    auVar69 = vmovshdup_avx(auVar74);
    fVar218 = auVar74._0_4_;
    fVar130 = (auVar69._0_4_ - fVar218) * 0.04761905;
    auVar198._4_4_ = fVar218;
    auVar198._0_4_ = fVar218;
    auVar198._8_4_ = fVar218;
    auVar198._12_4_ = fVar218;
    auVar198._16_4_ = fVar218;
    auVar198._20_4_ = fVar218;
    auVar198._24_4_ = fVar218;
    auVar198._28_4_ = fVar218;
    auVar152._0_8_ = auVar69._0_8_;
    auVar152._8_8_ = auVar152._0_8_;
    auVar152._16_8_ = auVar152._0_8_;
    auVar152._24_8_ = auVar152._0_8_;
    auVar99 = vsubps_avx(auVar152,auVar198);
    uVar139 = auVar77._0_4_;
    auVar153._4_4_ = uVar139;
    auVar153._0_4_ = uVar139;
    auVar153._8_4_ = uVar139;
    auVar153._12_4_ = uVar139;
    auVar153._16_4_ = uVar139;
    auVar153._20_4_ = uVar139;
    auVar153._24_4_ = uVar139;
    auVar153._28_4_ = uVar139;
    auVar215._8_4_ = 1;
    auVar215._0_8_ = 0x100000001;
    auVar215._12_4_ = 1;
    auVar215._16_4_ = 1;
    auVar215._20_4_ = 1;
    auVar215._24_4_ = 1;
    auVar215._28_4_ = 1;
    auVar110 = ZEXT1632(auVar77);
    auVar97 = vpermps_avx2(auVar215,auVar110);
    auVar100 = vbroadcastss_avx512vl(auVar78);
    auVar111 = ZEXT1632(auVar78);
    auVar98 = vpermps_avx512vl(auVar215,auVar111);
    auVar101 = vbroadcastss_avx512vl(auVar79);
    auVar106 = ZEXT1632(auVar79);
    auVar102 = vpermps_avx512vl(auVar215,auVar106);
    auVar103 = vbroadcastss_avx512vl(auVar80);
    auVar107 = ZEXT1632(auVar80);
    auVar104 = vpermps_avx512vl(auVar215,auVar107);
    auVar216._4_4_ = fVar130;
    auVar216._0_4_ = fVar130;
    auVar216._8_4_ = fVar130;
    auVar216._12_4_ = fVar130;
    auVar216._16_4_ = fVar130;
    auVar216._20_4_ = fVar130;
    auVar216._24_4_ = fVar130;
    auVar216._28_4_ = fVar130;
    auVar108 = auVar268._0_32_;
    auVar105 = vpermps_avx512vl(auVar108,auVar110);
    auVar185._8_4_ = 3;
    auVar185._0_8_ = 0x300000003;
    auVar185._12_4_ = 3;
    auVar185._16_4_ = 3;
    auVar185._20_4_ = 3;
    auVar185._24_4_ = 3;
    auVar185._28_4_ = 3;
    auVar96 = vpermps_avx512vl(auVar185,auVar110);
    auVar94 = vpermps_avx512vl(auVar108,auVar111);
    auVar110 = vpermps_avx2(auVar185,auVar111);
    auVar95 = vpermps_avx512vl(auVar108,auVar106);
    auVar111 = vpermps_avx2(auVar185,auVar106);
    auVar106 = vpermps_avx512vl(auVar108,auVar107);
    auVar107 = vpermps_avx512vl(auVar185,auVar107);
    auVar69 = vfmadd132ps_fma(auVar99,auVar198,_DAT_01f7b040);
    auVar99 = vsubps_avx(auVar254,ZEXT1632(auVar69));
    auVar108 = vmulps_avx512vl(auVar100,ZEXT1632(auVar69));
    auVar112 = ZEXT1632(auVar69);
    auVar109 = vmulps_avx512vl(auVar98,auVar112);
    auVar80 = vfmadd231ps_fma(auVar108,auVar99,auVar153);
    auVar77 = vfmadd231ps_fma(auVar109,auVar99,auVar97);
    auVar108 = vmulps_avx512vl(auVar101,auVar112);
    auVar109 = vmulps_avx512vl(auVar102,auVar112);
    auVar100 = vfmadd231ps_avx512vl(auVar108,auVar99,auVar100);
    auVar98 = vfmadd231ps_avx512vl(auVar109,auVar99,auVar98);
    auVar108 = vmulps_avx512vl(auVar103,auVar112);
    auVar109 = ZEXT1632(auVar69);
    auVar104 = vmulps_avx512vl(auVar104,auVar109);
    auVar101 = vfmadd231ps_avx512vl(auVar108,auVar99,auVar101);
    auVar102 = vfmadd231ps_avx512vl(auVar104,auVar99,auVar102);
    fVar227 = auVar69._0_4_;
    fVar228 = auVar69._4_4_;
    auVar29._4_4_ = fVar228 * auVar100._4_4_;
    auVar29._0_4_ = fVar227 * auVar100._0_4_;
    fVar229 = auVar69._8_4_;
    auVar29._8_4_ = fVar229 * auVar100._8_4_;
    fVar240 = auVar69._12_4_;
    auVar29._12_4_ = fVar240 * auVar100._12_4_;
    auVar29._16_4_ = auVar100._16_4_ * 0.0;
    auVar29._20_4_ = auVar100._20_4_ * 0.0;
    auVar29._24_4_ = auVar100._24_4_ * 0.0;
    auVar29._28_4_ = fVar218;
    auVar30._4_4_ = fVar228 * auVar98._4_4_;
    auVar30._0_4_ = fVar227 * auVar98._0_4_;
    auVar30._8_4_ = fVar229 * auVar98._8_4_;
    auVar30._12_4_ = fVar240 * auVar98._12_4_;
    auVar30._16_4_ = auVar98._16_4_ * 0.0;
    auVar30._20_4_ = auVar98._20_4_ * 0.0;
    auVar30._24_4_ = auVar98._24_4_ * 0.0;
    auVar30._28_4_ = auVar97._28_4_;
    auVar80 = vfmadd231ps_fma(auVar29,auVar99,ZEXT1632(auVar80));
    auVar77 = vfmadd231ps_fma(auVar30,auVar99,ZEXT1632(auVar77));
    auVar144._0_4_ = fVar227 * auVar101._0_4_;
    auVar144._4_4_ = fVar228 * auVar101._4_4_;
    auVar144._8_4_ = fVar229 * auVar101._8_4_;
    auVar144._12_4_ = fVar240 * auVar101._12_4_;
    auVar144._16_4_ = auVar101._16_4_ * 0.0;
    auVar144._20_4_ = auVar101._20_4_ * 0.0;
    auVar144._24_4_ = auVar101._24_4_ * 0.0;
    auVar144._28_4_ = 0;
    auVar31._4_4_ = fVar228 * auVar102._4_4_;
    auVar31._0_4_ = fVar227 * auVar102._0_4_;
    auVar31._8_4_ = fVar229 * auVar102._8_4_;
    auVar31._12_4_ = fVar240 * auVar102._12_4_;
    auVar31._16_4_ = auVar102._16_4_ * 0.0;
    auVar31._20_4_ = auVar102._20_4_ * 0.0;
    auVar31._24_4_ = auVar102._24_4_ * 0.0;
    auVar31._28_4_ = auVar101._28_4_;
    auVar78 = vfmadd231ps_fma(auVar144,auVar99,auVar100);
    auVar79 = vfmadd231ps_fma(auVar31,auVar99,auVar98);
    auVar32._28_4_ = auVar98._28_4_;
    auVar32._0_28_ =
         ZEXT1628(CONCAT412(fVar240 * auVar79._12_4_,
                            CONCAT48(fVar229 * auVar79._8_4_,
                                     CONCAT44(fVar228 * auVar79._4_4_,fVar227 * auVar79._0_4_))));
    auVar89 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar240 * auVar78._12_4_,
                                                 CONCAT48(fVar229 * auVar78._8_4_,
                                                          CONCAT44(fVar228 * auVar78._4_4_,
                                                                   fVar227 * auVar78._0_4_)))),
                              auVar99,ZEXT1632(auVar80));
    auVar93 = vfmadd231ps_fma(auVar32,auVar99,ZEXT1632(auVar77));
    auVar97 = vsubps_avx(ZEXT1632(auVar78),ZEXT1632(auVar80));
    auVar100 = vsubps_avx(ZEXT1632(auVar79),ZEXT1632(auVar77));
    auVar98 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
    auVar97 = vmulps_avx512vl(auVar97,auVar98);
    auVar100 = vmulps_avx512vl(auVar100,auVar98);
    auVar210._0_4_ = fVar130 * auVar97._0_4_;
    auVar210._4_4_ = fVar130 * auVar97._4_4_;
    auVar210._8_4_ = fVar130 * auVar97._8_4_;
    auVar210._12_4_ = fVar130 * auVar97._12_4_;
    auVar210._16_4_ = fVar130 * auVar97._16_4_;
    auVar210._20_4_ = fVar130 * auVar97._20_4_;
    auVar210._24_4_ = fVar130 * auVar97._24_4_;
    auVar210._28_4_ = 0;
    auVar97 = vmulps_avx512vl(auVar216,auVar100);
    auVar77 = vxorps_avx512vl(auVar103._0_16_,auVar103._0_16_);
    auVar100 = vpermt2ps_avx512vl(ZEXT1632(auVar89),_DAT_01fb9fc0,ZEXT1632(auVar77));
    auVar101 = vpermt2ps_avx512vl(ZEXT1632(auVar93),_DAT_01fb9fc0,ZEXT1632(auVar77));
    auVar145._0_4_ = auVar210._0_4_ + auVar89._0_4_;
    auVar145._4_4_ = auVar210._4_4_ + auVar89._4_4_;
    auVar145._8_4_ = auVar210._8_4_ + auVar89._8_4_;
    auVar145._12_4_ = auVar210._12_4_ + auVar89._12_4_;
    auVar145._16_4_ = auVar210._16_4_ + 0.0;
    auVar145._20_4_ = auVar210._20_4_ + 0.0;
    auVar145._24_4_ = auVar210._24_4_ + 0.0;
    auVar145._28_4_ = 0;
    auVar112 = ZEXT1632(auVar77);
    auVar102 = vpermt2ps_avx512vl(auVar210,_DAT_01fb9fc0,auVar112);
    auVar103 = vaddps_avx512vl(ZEXT1632(auVar93),auVar97);
    auVar104 = vpermt2ps_avx512vl(auVar97,_DAT_01fb9fc0,auVar112);
    auVar97 = vsubps_avx(auVar100,auVar102);
    auVar102 = vsubps_avx512vl(auVar101,auVar104);
    auVar104 = vmulps_avx512vl(auVar94,auVar109);
    auVar108 = vmulps_avx512vl(auVar110,auVar109);
    auVar104 = vfmadd231ps_avx512vl(auVar104,auVar99,auVar105);
    auVar105 = vfmadd231ps_avx512vl(auVar108,auVar99,auVar96);
    auVar96 = vmulps_avx512vl(auVar95,auVar109);
    auVar108 = vmulps_avx512vl(auVar111,auVar109);
    auVar96 = vfmadd231ps_avx512vl(auVar96,auVar99,auVar94);
    auVar110 = vfmadd231ps_avx512vl(auVar108,auVar99,auVar110);
    auVar94 = vmulps_avx512vl(auVar106,auVar109);
    auVar106 = vmulps_avx512vl(auVar107,auVar109);
    auVar80 = vfmadd231ps_fma(auVar94,auVar99,auVar95);
    auVar94 = vfmadd231ps_avx512vl(auVar106,auVar99,auVar111);
    auVar95 = vmulps_avx512vl(auVar109,auVar96);
    auVar107 = ZEXT1632(auVar69);
    auVar106 = vmulps_avx512vl(auVar107,auVar110);
    auVar104 = vfmadd231ps_avx512vl(auVar95,auVar99,auVar104);
    auVar105 = vfmadd231ps_avx512vl(auVar106,auVar99,auVar105);
    auVar94 = vmulps_avx512vl(auVar107,auVar94);
    auVar96 = vfmadd231ps_avx512vl
                        (ZEXT1632(CONCAT412(fVar240 * auVar80._12_4_,
                                            CONCAT48(fVar229 * auVar80._8_4_,
                                                     CONCAT44(fVar228 * auVar80._4_4_,
                                                              fVar227 * auVar80._0_4_)))),auVar99,
                         auVar96);
    auVar110 = vfmadd231ps_avx512vl(auVar94,auVar99,auVar110);
    auVar33._4_4_ = fVar228 * auVar96._4_4_;
    auVar33._0_4_ = fVar227 * auVar96._0_4_;
    auVar33._8_4_ = fVar229 * auVar96._8_4_;
    auVar33._12_4_ = fVar240 * auVar96._12_4_;
    auVar33._16_4_ = auVar96._16_4_ * 0.0;
    auVar33._20_4_ = auVar96._20_4_ * 0.0;
    auVar33._24_4_ = auVar96._24_4_ * 0.0;
    auVar33._28_4_ = auVar111._28_4_;
    auVar111 = vmulps_avx512vl(auVar107,auVar110);
    auVar94 = vfmadd231ps_avx512vl(auVar33,auVar99,auVar104);
    auVar111 = vfmadd231ps_avx512vl(auVar111,auVar105,auVar99);
    auVar99 = vsubps_avx512vl(auVar96,auVar104);
    auVar110 = vsubps_avx512vl(auVar110,auVar105);
    auVar99 = vmulps_avx512vl(auVar99,auVar98);
    auVar110 = vmulps_avx512vl(auVar110,auVar98);
    fVar218 = fVar130 * auVar99._0_4_;
    fVar227 = fVar130 * auVar99._4_4_;
    auVar34._4_4_ = fVar227;
    auVar34._0_4_ = fVar218;
    fVar228 = fVar130 * auVar99._8_4_;
    auVar34._8_4_ = fVar228;
    fVar229 = fVar130 * auVar99._12_4_;
    auVar34._12_4_ = fVar229;
    fVar240 = fVar130 * auVar99._16_4_;
    auVar34._16_4_ = fVar240;
    fVar241 = fVar130 * auVar99._20_4_;
    auVar34._20_4_ = fVar241;
    fVar130 = fVar130 * auVar99._24_4_;
    auVar34._24_4_ = fVar130;
    auVar34._28_4_ = auVar99._28_4_;
    auVar110 = vmulps_avx512vl(auVar216,auVar110);
    auVar98 = vpermt2ps_avx512vl(auVar94,_DAT_01fb9fc0,auVar112);
    auVar104 = vpermt2ps_avx512vl(auVar111,_DAT_01fb9fc0,auVar112);
    auVar217._0_4_ = auVar94._0_4_ + fVar218;
    auVar217._4_4_ = auVar94._4_4_ + fVar227;
    auVar217._8_4_ = auVar94._8_4_ + fVar228;
    auVar217._12_4_ = auVar94._12_4_ + fVar229;
    auVar217._16_4_ = auVar94._16_4_ + fVar240;
    auVar217._20_4_ = auVar94._20_4_ + fVar241;
    auVar217._24_4_ = auVar94._24_4_ + fVar130;
    auVar217._28_4_ = auVar94._28_4_ + auVar99._28_4_;
    auVar99 = vpermt2ps_avx512vl(auVar34,_DAT_01fb9fc0,ZEXT1632(auVar77));
    auVar105 = vaddps_avx512vl(auVar111,auVar110);
    auVar110 = vpermt2ps_avx512vl(auVar110,_DAT_01fb9fc0,ZEXT1632(auVar77));
    auVar99 = vsubps_avx(auVar98,auVar99);
    auVar110 = vsubps_avx512vl(auVar104,auVar110);
    auVar158 = ZEXT1632(auVar89);
    auVar96 = vsubps_avx512vl(auVar94,auVar158);
    auVar169 = ZEXT1632(auVar93);
    auVar95 = vsubps_avx512vl(auVar111,auVar169);
    auVar106 = vsubps_avx512vl(auVar98,auVar100);
    auVar96 = vaddps_avx512vl(auVar96,auVar106);
    auVar106 = vsubps_avx512vl(auVar104,auVar101);
    auVar95 = vaddps_avx512vl(auVar95,auVar106);
    auVar106 = vmulps_avx512vl(auVar169,auVar96);
    auVar106 = vfnmadd231ps_avx512vl(auVar106,auVar158,auVar95);
    auVar107 = vmulps_avx512vl(auVar103,auVar96);
    auVar107 = vfnmadd231ps_avx512vl(auVar107,auVar145,auVar95);
    auVar108 = vmulps_avx512vl(auVar102,auVar96);
    auVar108 = vfnmadd231ps_avx512vl(auVar108,auVar97,auVar95);
    auVar109 = vmulps_avx512vl(auVar101,auVar96);
    auVar109 = vfnmadd231ps_avx512vl(auVar109,auVar100,auVar95);
    auVar112 = vmulps_avx512vl(auVar111,auVar96);
    auVar112 = vfnmadd231ps_avx512vl(auVar112,auVar94,auVar95);
    auVar113 = vmulps_avx512vl(auVar105,auVar96);
    auVar113 = vfnmadd231ps_avx512vl(auVar113,auVar217,auVar95);
    auVar114 = vmulps_avx512vl(auVar110,auVar96);
    auVar114 = vfnmadd231ps_avx512vl(auVar114,auVar99,auVar95);
    auVar96 = vmulps_avx512vl(auVar104,auVar96);
    auVar96 = vfnmadd231ps_avx512vl(auVar96,auVar98,auVar95);
    auVar95 = vminps_avx512vl(auVar106,auVar107);
    auVar106 = vmaxps_avx512vl(auVar106,auVar107);
    auVar107 = vminps_avx512vl(auVar108,auVar109);
    auVar95 = vminps_avx512vl(auVar95,auVar107);
    auVar107 = vmaxps_avx512vl(auVar108,auVar109);
    auVar106 = vmaxps_avx512vl(auVar106,auVar107);
    auVar107 = vminps_avx512vl(auVar112,auVar113);
    auVar108 = vmaxps_avx512vl(auVar112,auVar113);
    auVar109 = vminps_avx512vl(auVar114,auVar96);
    auVar107 = vminps_avx512vl(auVar107,auVar109);
    auVar95 = vminps_avx512vl(auVar95,auVar107);
    auVar96 = vmaxps_avx512vl(auVar114,auVar96);
    auVar96 = vmaxps_avx512vl(auVar108,auVar96);
    auVar96 = vmaxps_avx512vl(auVar106,auVar96);
    uVar23 = vcmpps_avx512vl(auVar95,local_440,2);
    uVar24 = vcmpps_avx512vl(auVar96,local_460,5);
    bVar51 = (byte)uVar23 & (byte)uVar24 & 0x7f;
    if (bVar51 != 0) {
      auVar96 = vsubps_avx512vl(auVar100,auVar158);
      auVar95 = vsubps_avx512vl(auVar101,auVar169);
      auVar106 = vsubps_avx512vl(auVar98,auVar94);
      auVar96 = vaddps_avx512vl(auVar96,auVar106);
      auVar106 = vsubps_avx512vl(auVar104,auVar111);
      auVar95 = vaddps_avx512vl(auVar95,auVar106);
      auVar106 = vmulps_avx512vl(auVar169,auVar96);
      auVar106 = vfnmadd231ps_avx512vl(auVar106,auVar95,auVar158);
      auVar103 = vmulps_avx512vl(auVar103,auVar96);
      auVar103 = vfnmadd213ps_avx512vl(auVar145,auVar95,auVar103);
      auVar102 = vmulps_avx512vl(auVar102,auVar96);
      auVar102 = vfnmadd213ps_avx512vl(auVar97,auVar95,auVar102);
      auVar97 = vmulps_avx512vl(auVar101,auVar96);
      auVar101 = vfnmadd231ps_avx512vl(auVar97,auVar95,auVar100);
      auVar97 = vmulps_avx512vl(auVar111,auVar96);
      auVar111 = vfnmadd231ps_avx512vl(auVar97,auVar95,auVar94);
      auVar97 = vmulps_avx512vl(auVar105,auVar96);
      auVar105 = vfnmadd213ps_avx512vl(auVar217,auVar95,auVar97);
      auVar97 = vmulps_avx512vl(auVar110,auVar96);
      auVar94 = vfnmadd213ps_avx512vl(auVar99,auVar95,auVar97);
      auVar99 = vmulps_avx512vl(auVar104,auVar96);
      auVar98 = vfnmadd231ps_avx512vl(auVar99,auVar98,auVar95);
      auVar97 = vminps_avx(auVar106,auVar103);
      auVar99 = vmaxps_avx(auVar106,auVar103);
      auVar100 = vminps_avx(auVar102,auVar101);
      auVar100 = vminps_avx(auVar97,auVar100);
      auVar97 = vmaxps_avx(auVar102,auVar101);
      auVar99 = vmaxps_avx(auVar99,auVar97);
      auVar110 = vminps_avx(auVar111,auVar105);
      auVar97 = vmaxps_avx(auVar111,auVar105);
      auVar111 = vminps_avx(auVar94,auVar98);
      auVar110 = vminps_avx(auVar110,auVar111);
      auVar110 = vminps_avx(auVar100,auVar110);
      auVar100 = vmaxps_avx(auVar94,auVar98);
      auVar97 = vmaxps_avx(auVar97,auVar100);
      auVar99 = vmaxps_avx(auVar99,auVar97);
      uVar23 = vcmpps_avx512vl(auVar99,local_460,5);
      uVar24 = vcmpps_avx512vl(auVar110,local_440,2);
      bVar51 = bVar51 & (byte)uVar23 & (byte)uVar24;
      if (bVar51 != 0) {
        auStack_5f0[uVar53] = (uint)bVar51;
        uVar23 = vmovlps_avx(auVar74);
        (&uStack_420)[uVar53] = uVar23;
        uVar59 = vmovlps_avx(auVar66);
        auStack_3a0[uVar53] = uVar59;
        uVar53 = (ulong)((int)uVar53 + 1);
      }
    }
    auVar74 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
    auVar135 = ZEXT1664(auVar74);
    auVar74 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
    auVar262 = ZEXT1664(auVar74);
    auVar74 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
    auVar263 = ZEXT1664(auVar74);
    auVar99 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
    auVar264 = ZEXT3264(auVar99);
    auVar74 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
    auVar265 = ZEXT1664(auVar74);
    auVar74 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
    auVar266 = ZEXT1664(auVar74);
    auVar128._32_32_ = auVar127._32_32_;
    auVar128._0_32_ = _DAT_01fb9fe0;
    auVar267 = ZEXT3264(_DAT_01fb9fe0);
    auVar129._16_48_ = auVar128._16_48_;
    auVar129._0_16_ = auVar64;
LAB_01a000d2:
    do {
      do {
        do {
          if ((int)uVar53 == 0) {
            uVar139 = *(undefined4 *)(ray + k * 4 + 0x200);
            auVar28._4_4_ = uVar139;
            auVar28._0_4_ = uVar139;
            auVar28._8_4_ = uVar139;
            auVar28._12_4_ = uVar139;
            auVar28._16_4_ = uVar139;
            auVar28._20_4_ = uVar139;
            auVar28._24_4_ = uVar139;
            auVar28._28_4_ = uVar139;
            uVar23 = vcmpps_avx512vl(local_3c0,auVar28,2);
            uVar58 = (ulong)((uint)uVar58 & (uint)uVar23);
            goto LAB_019ff45f;
          }
          uVar52 = (int)uVar53 - 1;
          uVar54 = (ulong)uVar52;
          uVar7 = auStack_5f0[uVar54];
          auVar66._8_8_ = 0;
          auVar66._0_8_ = auStack_3a0[uVar54];
          uVar59 = 0;
          for (uVar57 = (ulong)uVar7; (uVar57 & 1) == 0; uVar57 = uVar57 >> 1 | 0x8000000000000000)
          {
            uVar59 = uVar59 + 1;
          }
          uVar56 = uVar7 - 1 & uVar7;
          bVar62 = uVar56 == 0;
          auStack_5f0[uVar54] = uVar56;
          if (bVar62) {
            uVar53 = (ulong)uVar52;
          }
          auVar131._8_8_ = 0;
          auVar131._0_8_ = uVar59;
          auVar74 = vpunpcklqdq_avx(auVar131,ZEXT416((int)uVar59 + 1));
          auVar127._32_32_ = auVar129._32_32_;
          auVar74 = vcvtqq2ps_avx512vl(auVar74);
          auVar74 = vmulps_avx512vl(auVar74,auVar265._0_16_);
          uVar139 = *(undefined4 *)((long)&uStack_420 + uVar54 * 8 + 4);
          auVar25._4_4_ = uVar139;
          auVar25._0_4_ = uVar139;
          auVar25._8_4_ = uVar139;
          auVar25._12_4_ = uVar139;
          auVar69 = vmulps_avx512vl(auVar74,auVar25);
          auVar80 = auVar266._0_16_;
          auVar74 = vsubps_avx512vl(auVar80,auVar74);
          uVar139 = *(undefined4 *)(&uStack_420 + uVar54);
          auVar26._4_4_ = uVar139;
          auVar26._0_4_ = uVar139;
          auVar26._8_4_ = uVar139;
          auVar26._12_4_ = uVar139;
          auVar74 = vfmadd231ps_avx512vl(auVar69,auVar74,auVar26);
          auVar69 = vmovshdup_avx(auVar74);
          fVar130 = auVar69._0_4_ - auVar74._0_4_;
          vucomiss_avx512f(ZEXT416((uint)fVar130));
          if (uVar7 == 0 || bVar62) goto LAB_019ffbdb;
          auVar69 = vshufps_avx(auVar66,auVar66,0x50);
          vucomiss_avx512f(ZEXT416((uint)fVar130));
          auVar79 = vsubps_avx512vl(auVar80,auVar69);
          fVar218 = auVar69._0_4_;
          auVar164._0_4_ = fVar218 * fVar136;
          fVar227 = auVar69._4_4_;
          auVar164._4_4_ = fVar227 * fVar137;
          fVar228 = auVar69._8_4_;
          auVar164._8_4_ = fVar228 * fVar136;
          fVar229 = auVar69._12_4_;
          auVar164._12_4_ = fVar229 * fVar137;
          auVar173._0_4_ = fVar218 * fVar138;
          auVar173._4_4_ = fVar227 * fVar146;
          auVar173._8_4_ = fVar228 * fVar138;
          auVar173._12_4_ = fVar229 * fVar146;
          auVar181._0_4_ = fVar218 * fVar154;
          auVar181._4_4_ = fVar227 * fVar160;
          auVar181._8_4_ = fVar228 * fVar154;
          auVar181._12_4_ = fVar229 * fVar160;
          auVar147._0_4_ = fVar218 * fVar161;
          auVar147._4_4_ = fVar227 * fVar162;
          auVar147._8_4_ = fVar228 * fVar161;
          auVar147._12_4_ = fVar229 * fVar162;
          auVar69 = vfmadd231ps_fma(auVar164,auVar79,auVar72);
          auVar77 = vfmadd231ps_fma(auVar173,auVar79,auVar75);
          auVar78 = vfmadd231ps_fma(auVar181,auVar79,auVar70);
          auVar79 = vfmadd231ps_fma(auVar147,auVar79,auVar76);
          auVar159._16_16_ = auVar69;
          auVar159._0_16_ = auVar69;
          auVar170._16_16_ = auVar77;
          auVar170._0_16_ = auVar77;
          auVar178._16_16_ = auVar78;
          auVar178._0_16_ = auVar78;
          auVar97 = vpermps_avx512vl(auVar267._0_32_,ZEXT1632(auVar74));
          auVar99 = vsubps_avx(auVar170,auVar159);
          auVar77 = vfmadd213ps_fma(auVar99,auVar97,auVar159);
          auVar99 = vsubps_avx(auVar178,auVar170);
          auVar89 = vfmadd213ps_fma(auVar99,auVar97,auVar170);
          auVar69 = vsubps_avx(auVar79,auVar78);
          auVar171._16_16_ = auVar69;
          auVar171._0_16_ = auVar69;
          auVar69 = vfmadd213ps_fma(auVar171,auVar97,auVar178);
          auVar99 = vsubps_avx(ZEXT1632(auVar89),ZEXT1632(auVar77));
          auVar77 = vfmadd213ps_fma(auVar99,auVar97,ZEXT1632(auVar77));
          auVar99 = vsubps_avx(ZEXT1632(auVar69),ZEXT1632(auVar89));
          auVar69 = vfmadd213ps_fma(auVar99,auVar97,ZEXT1632(auVar89));
          auVar99 = vsubps_avx(ZEXT1632(auVar69),ZEXT1632(auVar77));
          auVar92 = vfmadd231ps_fma(ZEXT1632(auVar77),auVar99,auVar97);
          auVar127._0_32_ = vmulps_avx512vl(auVar99,auVar264._0_32_);
          fVar218 = fVar130 * 0.33333334;
          auVar182._0_8_ =
               CONCAT44(auVar92._4_4_ + fVar218 * auVar127._4_4_,
                        auVar92._0_4_ + fVar218 * auVar127._0_4_);
          auVar182._8_4_ = auVar92._8_4_ + fVar218 * auVar127._8_4_;
          auVar182._12_4_ = auVar92._12_4_ + fVar218 * auVar127._12_4_;
          auVar165._0_4_ = fVar218 * auVar127._16_4_;
          auVar165._4_4_ = fVar218 * auVar127._20_4_;
          auVar165._8_4_ = fVar218 * auVar127._24_4_;
          auVar165._12_4_ = fVar218 * auVar127._28_4_;
          auVar87 = vsubps_avx((undefined1  [16])0x0,auVar165);
          auVar89 = vshufpd_avx(auVar92,auVar92,3);
          auVar93 = vshufpd_avx((undefined1  [16])0x0,(undefined1  [16])0x0,3);
          auVar69 = vsubps_avx(auVar89,auVar92);
          auVar77 = vsubps_avx(auVar93,(undefined1  [16])0x0);
          auVar203._0_4_ = auVar69._0_4_ + auVar77._0_4_;
          auVar203._4_4_ = auVar69._4_4_ + auVar77._4_4_;
          auVar203._8_4_ = auVar69._8_4_ + auVar77._8_4_;
          auVar203._12_4_ = auVar69._12_4_ + auVar77._12_4_;
          auVar69 = vshufps_avx(auVar92,auVar92,0xb1);
          auVar77 = vshufps_avx(auVar182,auVar182,0xb1);
          auVar78 = vshufps_avx(auVar87,auVar87,0xb1);
          auVar79 = vshufps_avx((undefined1  [16])0x0,(undefined1  [16])0x0,0xb1);
          auVar252._4_4_ = auVar203._0_4_;
          auVar252._0_4_ = auVar203._0_4_;
          auVar252._8_4_ = auVar203._0_4_;
          auVar252._12_4_ = auVar203._0_4_;
          auVar83 = vshufps_avx(auVar203,auVar203,0x55);
          fVar218 = auVar83._0_4_;
          auVar213._0_4_ = auVar69._0_4_ * fVar218;
          fVar227 = auVar83._4_4_;
          auVar213._4_4_ = auVar69._4_4_ * fVar227;
          fVar228 = auVar83._8_4_;
          auVar213._8_4_ = auVar69._8_4_ * fVar228;
          fVar229 = auVar83._12_4_;
          auVar213._12_4_ = auVar69._12_4_ * fVar229;
          auVar220._0_4_ = auVar77._0_4_ * fVar218;
          auVar220._4_4_ = auVar77._4_4_ * fVar227;
          auVar220._8_4_ = auVar77._8_4_ * fVar228;
          auVar220._12_4_ = auVar77._12_4_ * fVar229;
          auVar232._0_4_ = auVar78._0_4_ * fVar218;
          auVar232._4_4_ = auVar78._4_4_ * fVar227;
          auVar232._8_4_ = auVar78._8_4_ * fVar228;
          auVar232._12_4_ = auVar78._12_4_ * fVar229;
          auVar204._0_4_ = auVar79._0_4_ * fVar218;
          auVar204._4_4_ = auVar79._4_4_ * fVar227;
          auVar204._8_4_ = auVar79._8_4_ * fVar228;
          auVar204._12_4_ = auVar79._12_4_ * fVar229;
          auVar69 = vfmadd231ps_fma(auVar213,auVar252,auVar92);
          auVar77 = vfmadd231ps_fma(auVar220,auVar252,auVar182);
          auVar85 = vfmadd231ps_fma(auVar232,auVar252,auVar87);
          auVar86 = vfmadd231ps_fma(auVar204,(undefined1  [16])0x0,auVar252);
          auVar83 = vshufpd_avx(auVar69,auVar69,1);
          auVar84 = vshufpd_avx(auVar77,auVar77,1);
          auVar129._16_48_ = auVar127._16_48_;
          auVar81 = vshufpd_avx512vl(auVar85,auVar85,1);
          auVar82 = vshufpd_avx512vl(auVar86,auVar86,1);
          auVar78 = vminss_avx(auVar69,auVar77);
          auVar69 = vmaxss_avx(auVar77,auVar69);
          auVar79 = vminss_avx(auVar85,auVar86);
          auVar77 = vmaxss_avx(auVar86,auVar85);
          auVar78 = vminss_avx(auVar78,auVar79);
          auVar69 = vmaxss_avx(auVar77,auVar69);
          auVar79 = vminss_avx(auVar83,auVar84);
          auVar77 = vmaxss_avx(auVar84,auVar83);
          auVar83 = vminss_avx512f(auVar81,auVar82);
          auVar84 = vmaxss_avx512f(auVar82,auVar81);
          auVar77 = vmaxss_avx(auVar84,auVar77);
          auVar129._0_16_ = vminss_avx512f(auVar79,auVar83);
          fVar227 = auVar77._0_4_;
          fVar218 = auVar69._0_4_;
          if (auVar78._0_4_ < 0.0001) {
            bVar63 = fVar227 == -0.0001;
            bVar60 = NAN(fVar227);
            if (fVar227 <= -0.0001) goto LAB_01a0030a;
            break;
          }
LAB_01a0030a:
          vucomiss_avx512f(auVar129._0_16_);
          bVar63 = fVar227 <= -0.0001;
          bVar61 = -0.0001 < fVar218;
          bVar60 = bVar63;
          if (!bVar63) break;
          uVar23 = vcmpps_avx512vl(auVar78,SUB6416(ZEXT464(0x38d1b717),0),5);
          uVar24 = vcmpps_avx512vl(auVar129._0_16_,SUB6416(ZEXT464(0x38d1b717),0),5);
          uVar52 = (uint)uVar23 & (uint)uVar24;
          bVar12 = (uVar52 & 1) == 0;
          bVar63 = bVar61 && bVar12;
          bVar60 = bVar61 && (uVar52 & 1) == 0;
        } while (!bVar61 || !bVar12);
        auVar84 = vxorps_avx512vl(auVar270._0_16_,auVar270._0_16_);
        auVar270 = ZEXT1664(auVar84);
        vcmpss_avx512f(auVar78,auVar84,1);
        uVar23 = vcmpss_avx512f(auVar69,auVar84,1);
        bVar61 = (bool)((byte)uVar23 & 1);
        auVar116._16_48_ = auVar129._16_48_;
        auVar116._0_16_ = auVar271._0_16_;
        auVar115._4_60_ = auVar116._4_60_;
        auVar115._0_4_ = (float)((uint)bVar61 * -0x40800000 + (uint)!bVar61 * auVar271._0_4_);
        vucomiss_avx512f(auVar115._0_16_);
        bVar60 = (bool)(!bVar63 | bVar60);
        bVar61 = bVar60 == false;
        auVar118._16_48_ = auVar129._16_48_;
        auVar118._0_16_ = SUB6416(ZEXT464(0x7f800000),0);
        auVar117._4_60_ = auVar118._4_60_;
        auVar117._0_4_ = (uint)bVar60 * auVar84._0_4_ + (uint)!bVar60 * 0x7f800000;
        auVar83 = auVar117._0_16_;
        auVar120._16_48_ = auVar129._16_48_;
        auVar120._0_16_ = SUB6416(ZEXT464(0xff800000),0);
        auVar119._4_60_ = auVar120._4_60_;
        auVar119._0_4_ = (uint)bVar60 * auVar84._0_4_ + (uint)!bVar60 * -0x800000;
        auVar79 = auVar119._0_16_;
        auVar85 = vxorps_avx512vl(auVar269._0_16_,auVar269._0_16_);
        auVar269 = ZEXT1664(auVar85);
        uVar23 = vcmpss_avx512f(auVar129._0_16_,auVar84,1);
        bVar63 = (bool)((byte)uVar23 & 1);
        auVar122._16_48_ = auVar129._16_48_;
        auVar122._0_16_ = auVar271._0_16_;
        auVar121._4_60_ = auVar122._4_60_;
        auVar121._0_4_ = (float)((uint)bVar63 * -0x40800000 + (uint)!bVar63 * auVar271._0_4_);
        vucomiss_avx512f(auVar121._0_16_);
        if ((bVar60) || (bVar61)) {
          auVar84 = vucomiss_avx512f(auVar78);
          if ((bVar60) || (bVar61)) {
            auVar86 = vxorps_avx512vl(auVar78,auVar263._0_16_);
            auVar78 = vsubss_avx512f(auVar84,auVar78);
            auVar78 = vdivss_avx512f(auVar86,auVar78);
            auVar84 = vsubss_avx512f(ZEXT416(0x3f800000),auVar78);
            auVar84 = vfmadd213ss_avx512f(auVar84,auVar85,auVar78);
            auVar78 = auVar84;
          }
          else {
            auVar78 = vxorps_avx512vl(auVar84,auVar84);
            vucomiss_avx512f(auVar78);
            auVar84 = ZEXT416(0x3f800000);
            if ((bVar60) || (bVar61)) {
              auVar84 = SUB6416(ZEXT464(0xff800000),0);
              auVar78 = ZEXT416(0x7f800000);
            }
          }
          auVar83 = vminss_avx512f(auVar83,auVar78);
          auVar79 = vmaxss_avx(auVar84,auVar79);
        }
        auVar271 = ZEXT464(0x3f800000);
        uVar23 = vcmpss_avx512f(auVar77,auVar85,1);
        bVar63 = (bool)((byte)uVar23 & 1);
        auVar77 = auVar271._0_16_;
        fVar228 = (float)((uint)bVar63 * -0x40800000 + (uint)!bVar63 * 0x3f800000);
        if ((auVar115._0_4_ != fVar228) || (NAN(auVar115._0_4_) || NAN(fVar228))) {
          if ((fVar227 != fVar218) || (NAN(fVar227) || NAN(fVar218))) {
            auVar69 = vxorps_avx512vl(auVar69,auVar263._0_16_);
            auVar205._0_4_ = auVar69._0_4_ / (fVar227 - fVar218);
            auVar205._4_12_ = auVar69._4_12_;
            auVar69 = vsubss_avx512f(auVar77,auVar205);
            auVar69 = vfmadd213ss_avx512f(auVar69,auVar85,auVar205);
            auVar78 = auVar69;
          }
          else if ((fVar218 != 0.0) ||
                  (auVar69 = auVar77, auVar78 = SUB6416(ZEXT864(0),0) << 0x20, NAN(fVar218))) {
            auVar69 = SUB6416(ZEXT464(0xff800000),0);
            auVar78 = SUB6416(ZEXT464(0x7f800000),0);
          }
          auVar83 = vminss_avx(auVar83,auVar78);
          auVar79 = vmaxss_avx(auVar69,auVar79);
        }
        bVar63 = auVar121._0_4_ != fVar228;
        auVar69 = vminss_avx512f(auVar83,auVar77);
        auVar124._16_48_ = auVar129._16_48_;
        auVar124._0_16_ = auVar83;
        auVar123._4_60_ = auVar124._4_60_;
        auVar123._0_4_ = (uint)bVar63 * auVar69._0_4_ + (uint)!bVar63 * auVar83._0_4_;
        auVar69 = vmaxss_avx512f(auVar77,auVar79);
        auVar126._16_48_ = auVar129._16_48_;
        auVar126._0_16_ = auVar79;
        auVar125._4_60_ = auVar126._4_60_;
        auVar125._0_4_ = (uint)bVar63 * auVar69._0_4_ + (uint)!bVar63 * auVar79._0_4_;
        auVar69 = vmaxss_avx512f(auVar85,auVar123._0_16_);
        auVar129._0_16_ = vminss_avx512f(auVar125._0_16_,auVar77);
      } while (auVar129._0_4_ < auVar69._0_4_);
      auVar86 = vmaxss_avx512f(auVar85,ZEXT416((uint)(auVar69._0_4_ + -0.1)));
      auVar82 = vminss_avx512f(ZEXT416((uint)(auVar129._0_4_ + 0.1)),auVar77);
      auVar148._0_8_ = auVar92._0_8_;
      auVar148._8_8_ = auVar148._0_8_;
      auVar221._8_8_ = auVar182._0_8_;
      auVar221._0_8_ = auVar182._0_8_;
      auVar233._8_8_ = auVar87._0_8_;
      auVar233._0_8_ = auVar87._0_8_;
      auVar69 = vshufpd_avx(auVar182,auVar182,3);
      auVar78 = vshufpd_avx(auVar87,auVar87,3);
      auVar79 = vshufps_avx(auVar86,auVar82,0);
      auVar84 = vsubps_avx512vl(auVar80,auVar79);
      fVar218 = auVar79._0_4_;
      auVar174._0_4_ = fVar218 * auVar89._0_4_;
      fVar227 = auVar79._4_4_;
      auVar174._4_4_ = fVar227 * auVar89._4_4_;
      fVar228 = auVar79._8_4_;
      auVar174._8_4_ = fVar228 * auVar89._8_4_;
      fVar229 = auVar79._12_4_;
      auVar174._12_4_ = fVar229 * auVar89._12_4_;
      auVar183._0_4_ = fVar218 * auVar69._0_4_;
      auVar183._4_4_ = fVar227 * auVar69._4_4_;
      auVar183._8_4_ = fVar228 * auVar69._8_4_;
      auVar183._12_4_ = fVar229 * auVar69._12_4_;
      auVar256._0_4_ = auVar78._0_4_ * fVar218;
      auVar256._4_4_ = auVar78._4_4_ * fVar227;
      auVar256._8_4_ = auVar78._8_4_ * fVar228;
      auVar256._12_4_ = auVar78._12_4_ * fVar229;
      auVar166._0_4_ = fVar218 * auVar93._0_4_;
      auVar166._4_4_ = fVar227 * auVar93._4_4_;
      auVar166._8_4_ = fVar228 * auVar93._8_4_;
      auVar166._12_4_ = fVar229 * auVar93._12_4_;
      auVar89 = vfmadd231ps_fma(auVar174,auVar84,auVar148);
      auVar93 = vfmadd231ps_fma(auVar183,auVar84,auVar221);
      auVar83 = vfmadd231ps_fma(auVar256,auVar84,auVar233);
      auVar84 = vfmadd231ps_fma(auVar166,auVar84,ZEXT816(0));
      auVar78 = vsubss_avx512f(auVar77,auVar86);
      auVar69 = vmovshdup_avx(auVar66);
      auVar81 = vfmadd231ss_fma(ZEXT416((uint)(auVar69._0_4_ * auVar86._0_4_)),auVar66,auVar78);
      auVar78 = vsubss_avx512f(auVar77,auVar82);
      auVar82 = vfmadd231ss_fma(ZEXT416((uint)(auVar69._0_4_ * auVar82._0_4_)),auVar66,auVar78);
      auVar87 = vdivss_avx512f(auVar77,ZEXT416((uint)fVar130));
      auVar66 = vsubps_avx(auVar93,auVar89);
      auVar86 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
      auVar78 = vmulps_avx512vl(auVar66,auVar86);
      auVar66 = vsubps_avx(auVar83,auVar93);
      auVar79 = vmulps_avx512vl(auVar66,auVar86);
      auVar66 = vsubps_avx(auVar84,auVar83);
      auVar66 = vmulps_avx512vl(auVar66,auVar86);
      auVar69 = vminps_avx(auVar79,auVar66);
      auVar66 = vmaxps_avx(auVar79,auVar66);
      auVar69 = vminps_avx(auVar78,auVar69);
      auVar66 = vmaxps_avx(auVar78,auVar66);
      auVar78 = vshufpd_avx(auVar69,auVar69,3);
      auVar79 = vshufpd_avx(auVar66,auVar66,3);
      auVar69 = vminps_avx(auVar69,auVar78);
      auVar66 = vmaxps_avx(auVar66,auVar79);
      fVar130 = auVar87._0_4_;
      auVar206._0_4_ = auVar69._0_4_ * fVar130;
      auVar206._4_4_ = auVar69._4_4_ * fVar130;
      auVar206._8_4_ = auVar69._8_4_ * fVar130;
      auVar206._12_4_ = auVar69._12_4_ * fVar130;
      auVar191._0_4_ = fVar130 * auVar66._0_4_;
      auVar191._4_4_ = fVar130 * auVar66._4_4_;
      auVar191._8_4_ = fVar130 * auVar66._8_4_;
      auVar191._12_4_ = fVar130 * auVar66._12_4_;
      auVar87 = vdivss_avx512f(auVar77,ZEXT416((uint)(auVar82._0_4_ - auVar81._0_4_)));
      auVar66 = vshufpd_avx(auVar89,auVar89,3);
      auVar69 = vshufpd_avx(auVar93,auVar93,3);
      auVar78 = vshufpd_avx(auVar83,auVar83,3);
      auVar79 = vshufpd_avx(auVar84,auVar84,3);
      auVar66 = vsubps_avx(auVar66,auVar89);
      auVar89 = vsubps_avx(auVar69,auVar93);
      auVar93 = vsubps_avx(auVar78,auVar83);
      auVar79 = vsubps_avx(auVar79,auVar84);
      auVar69 = vminps_avx(auVar66,auVar89);
      auVar66 = vmaxps_avx(auVar66,auVar89);
      auVar78 = vminps_avx(auVar93,auVar79);
      auVar78 = vminps_avx(auVar69,auVar78);
      auVar69 = vmaxps_avx(auVar93,auVar79);
      auVar66 = vmaxps_avx(auVar66,auVar69);
      fVar130 = auVar87._0_4_;
      auVar234._0_4_ = fVar130 * auVar78._0_4_;
      auVar234._4_4_ = fVar130 * auVar78._4_4_;
      auVar234._8_4_ = fVar130 * auVar78._8_4_;
      auVar234._12_4_ = fVar130 * auVar78._12_4_;
      auVar222._0_4_ = fVar130 * auVar66._0_4_;
      auVar222._4_4_ = fVar130 * auVar66._4_4_;
      auVar222._8_4_ = fVar130 * auVar66._8_4_;
      auVar222._12_4_ = fVar130 * auVar66._12_4_;
      auVar79 = vinsertps_avx(auVar74,auVar81,0x10);
      auVar88 = vpermt2ps_avx512vl(auVar74,_DAT_01fb9f90,auVar82);
      auVar140._0_4_ = auVar79._0_4_ + auVar88._0_4_;
      auVar140._4_4_ = auVar79._4_4_ + auVar88._4_4_;
      auVar140._8_4_ = auVar79._8_4_ + auVar88._8_4_;
      auVar140._12_4_ = auVar79._12_4_ + auVar88._12_4_;
      auVar87 = vmulps_avx512vl(auVar140,auVar135._0_16_);
      auVar69 = vshufps_avx(auVar87,auVar87,0x54);
      uVar139 = auVar87._0_4_;
      auVar142._4_4_ = uVar139;
      auVar142._0_4_ = uVar139;
      auVar142._8_4_ = uVar139;
      auVar142._12_4_ = uVar139;
      auVar78 = vfmadd213ps_fma(auVar64,auVar142,auVar3);
      auVar89 = vfmadd213ps_fma(local_470,auVar142,auVar73);
      auVar93 = vfmadd213ps_fma(local_480,auVar142,auVar71);
      auVar66 = vsubps_avx(auVar89,auVar78);
      auVar78 = vfmadd213ps_fma(auVar66,auVar142,auVar78);
      auVar66 = vsubps_avx(auVar93,auVar89);
      auVar66 = vfmadd213ps_fma(auVar66,auVar142,auVar89);
      auVar66 = vsubps_avx(auVar66,auVar78);
      auVar78 = vfmadd231ps_fma(auVar78,auVar66,auVar142);
      auVar83 = vmulps_avx512vl(auVar66,auVar86);
      auVar244._8_8_ = auVar78._0_8_;
      auVar244._0_8_ = auVar78._0_8_;
      auVar66 = vshufpd_avx(auVar78,auVar78,3);
      auVar78 = vshufps_avx(auVar87,auVar87,0x55);
      auVar89 = vsubps_avx(auVar66,auVar244);
      auVar93 = vfmadd231ps_fma(auVar244,auVar78,auVar89);
      auVar257._8_8_ = auVar83._0_8_;
      auVar257._0_8_ = auVar83._0_8_;
      auVar66 = vshufpd_avx(auVar83,auVar83,3);
      auVar66 = vsubps_avx512vl(auVar66,auVar257);
      auVar66 = vfmadd213ps_avx512vl(auVar66,auVar78,auVar257);
      auVar143._0_8_ = auVar89._0_8_ ^ 0x8000000080000000;
      auVar143._8_4_ = auVar89._8_4_ ^ 0x80000000;
      auVar143._12_4_ = auVar89._12_4_ ^ 0x80000000;
      auVar78 = vmovshdup_avx512vl(auVar66);
      auVar258._0_8_ = auVar78._0_8_ ^ 0x8000000080000000;
      auVar258._8_4_ = auVar78._8_4_ ^ 0x80000000;
      auVar258._12_4_ = auVar78._12_4_ ^ 0x80000000;
      auVar83 = vmovshdup_avx512vl(auVar89);
      auVar84 = vpermt2ps_avx512vl(auVar258,ZEXT416(5),auVar89);
      auVar270 = ZEXT464(0x40400000);
      auVar78 = vfmsub231ss_avx512f(ZEXT416((uint)(auVar78._0_4_ * auVar89._0_4_)),auVar66,auVar83);
      auVar89 = vpermt2ps_avx512vl(auVar66,SUB6416(ZEXT464(4),0),auVar143);
      auVar167._0_4_ = auVar78._0_4_;
      auVar167._4_4_ = auVar167._0_4_;
      auVar167._8_4_ = auVar167._0_4_;
      auVar167._12_4_ = auVar167._0_4_;
      auVar66 = vdivps_avx(auVar84,auVar167);
      auVar90 = vdivps_avx512vl(auVar89,auVar167);
      fVar130 = auVar93._0_4_;
      auVar78 = vshufps_avx(auVar93,auVar93,0x55);
      auVar245._0_4_ = fVar130 * auVar66._0_4_ + auVar78._0_4_ * auVar90._0_4_;
      auVar245._4_4_ = fVar130 * auVar66._4_4_ + auVar78._4_4_ * auVar90._4_4_;
      auVar245._8_4_ = fVar130 * auVar66._8_4_ + auVar78._8_4_ * auVar90._8_4_;
      auVar245._12_4_ = fVar130 * auVar66._12_4_ + auVar78._12_4_ * auVar90._12_4_;
      auVar86 = vsubps_avx(auVar69,auVar245);
      auVar78 = vmovshdup_avx(auVar66);
      auVar69 = vinsertps_avx(auVar206,auVar234,0x1c);
      auVar259._0_4_ = auVar78._0_4_ * auVar69._0_4_;
      auVar259._4_4_ = auVar78._4_4_ * auVar69._4_4_;
      auVar259._8_4_ = auVar78._8_4_ * auVar69._8_4_;
      auVar259._12_4_ = auVar78._12_4_ * auVar69._12_4_;
      auVar92 = vinsertps_avx512f(auVar191,auVar222,0x1c);
      auVar78 = vmulps_avx512vl(auVar78,auVar92);
      auVar84 = vminps_avx512vl(auVar259,auVar78);
      auVar93 = vmaxps_avx(auVar78,auVar259);
      auVar83 = vmovshdup_avx(auVar90);
      auVar78 = vinsertps_avx(auVar234,auVar206,0x4c);
      auVar235._0_4_ = auVar83._0_4_ * auVar78._0_4_;
      auVar235._4_4_ = auVar83._4_4_ * auVar78._4_4_;
      auVar235._8_4_ = auVar83._8_4_ * auVar78._8_4_;
      auVar235._12_4_ = auVar83._12_4_ * auVar78._12_4_;
      auVar89 = vinsertps_avx(auVar222,auVar191,0x4c);
      auVar223._0_4_ = auVar83._0_4_ * auVar89._0_4_;
      auVar223._4_4_ = auVar83._4_4_ * auVar89._4_4_;
      auVar223._8_4_ = auVar83._8_4_ * auVar89._8_4_;
      auVar223._12_4_ = auVar83._12_4_ * auVar89._12_4_;
      auVar83 = vminps_avx(auVar235,auVar223);
      auVar84 = vaddps_avx512vl(auVar84,auVar83);
      auVar83 = vmaxps_avx(auVar223,auVar235);
      auVar224._0_4_ = auVar93._0_4_ + auVar83._0_4_;
      auVar224._4_4_ = auVar93._4_4_ + auVar83._4_4_;
      auVar224._8_4_ = auVar93._8_4_ + auVar83._8_4_;
      auVar224._12_4_ = auVar93._12_4_ + auVar83._12_4_;
      auVar236._8_8_ = 0x3f80000000000000;
      auVar236._0_8_ = 0x3f80000000000000;
      auVar93 = vsubps_avx(auVar236,auVar224);
      auVar83 = vsubps_avx(auVar236,auVar84);
      auVar84 = vsubps_avx(auVar79,auVar87);
      auVar87 = vsubps_avx(auVar88,auVar87);
      fVar229 = auVar84._0_4_;
      auVar260._0_4_ = fVar229 * auVar93._0_4_;
      fVar240 = auVar84._4_4_;
      auVar260._4_4_ = fVar240 * auVar93._4_4_;
      fVar241 = auVar84._8_4_;
      auVar260._8_4_ = fVar241 * auVar93._8_4_;
      fVar242 = auVar84._12_4_;
      auVar260._12_4_ = fVar242 * auVar93._12_4_;
      auVar91 = vbroadcastss_avx512vl(auVar66);
      auVar69 = vmulps_avx512vl(auVar91,auVar69);
      auVar92 = vmulps_avx512vl(auVar91,auVar92);
      auVar91 = vminps_avx512vl(auVar69,auVar92);
      auVar92 = vmaxps_avx512vl(auVar92,auVar69);
      auVar69 = vbroadcastss_avx512vl(auVar90);
      auVar78 = vmulps_avx512vl(auVar69,auVar78);
      auVar69 = vmulps_avx512vl(auVar69,auVar89);
      auVar89 = vminps_avx512vl(auVar78,auVar69);
      auVar89 = vaddps_avx512vl(auVar91,auVar89);
      auVar84 = vmulps_avx512vl(auVar84,auVar83);
      fVar130 = auVar87._0_4_;
      auVar225._0_4_ = fVar130 * auVar93._0_4_;
      fVar218 = auVar87._4_4_;
      auVar225._4_4_ = fVar218 * auVar93._4_4_;
      fVar227 = auVar87._8_4_;
      auVar225._8_4_ = fVar227 * auVar93._8_4_;
      fVar228 = auVar87._12_4_;
      auVar225._12_4_ = fVar228 * auVar93._12_4_;
      auVar237._0_4_ = fVar130 * auVar83._0_4_;
      auVar237._4_4_ = fVar218 * auVar83._4_4_;
      auVar237._8_4_ = fVar227 * auVar83._8_4_;
      auVar237._12_4_ = fVar228 * auVar83._12_4_;
      auVar69 = vmaxps_avx(auVar69,auVar78);
      auVar192._0_4_ = auVar92._0_4_ + auVar69._0_4_;
      auVar192._4_4_ = auVar92._4_4_ + auVar69._4_4_;
      auVar192._8_4_ = auVar92._8_4_ + auVar69._8_4_;
      auVar192._12_4_ = auVar92._12_4_ + auVar69._12_4_;
      auVar207._8_8_ = 0x3f800000;
      auVar207._0_8_ = 0x3f800000;
      auVar69 = vsubps_avx(auVar207,auVar192);
      auVar78 = vsubps_avx512vl(auVar207,auVar89);
      auVar253._0_4_ = fVar229 * auVar69._0_4_;
      auVar253._4_4_ = fVar240 * auVar69._4_4_;
      auVar253._8_4_ = fVar241 * auVar69._8_4_;
      auVar253._12_4_ = fVar242 * auVar69._12_4_;
      auVar246._0_4_ = fVar229 * auVar78._0_4_;
      auVar246._4_4_ = fVar240 * auVar78._4_4_;
      auVar246._8_4_ = fVar241 * auVar78._8_4_;
      auVar246._12_4_ = fVar242 * auVar78._12_4_;
      auVar193._0_4_ = fVar130 * auVar69._0_4_;
      auVar193._4_4_ = fVar218 * auVar69._4_4_;
      auVar193._8_4_ = fVar227 * auVar69._8_4_;
      auVar193._12_4_ = fVar228 * auVar69._12_4_;
      auVar208._0_4_ = fVar130 * auVar78._0_4_;
      auVar208._4_4_ = fVar218 * auVar78._4_4_;
      auVar208._8_4_ = fVar227 * auVar78._8_4_;
      auVar208._12_4_ = fVar228 * auVar78._12_4_;
      auVar69 = vminps_avx(auVar253,auVar246);
      auVar78 = vminps_avx512vl(auVar193,auVar208);
      auVar89 = vminps_avx512vl(auVar69,auVar78);
      auVar69 = vmaxps_avx(auVar246,auVar253);
      auVar78 = vmaxps_avx(auVar208,auVar193);
      auVar78 = vmaxps_avx(auVar78,auVar69);
      auVar93 = vminps_avx512vl(auVar260,auVar84);
      auVar69 = vminps_avx(auVar225,auVar237);
      auVar69 = vminps_avx(auVar93,auVar69);
      auVar69 = vhaddps_avx(auVar89,auVar69);
      auVar129._0_16_ = vmaxps_avx512vl(auVar84,auVar260);
      auVar89 = vmaxps_avx(auVar237,auVar225);
      auVar89 = vmaxps_avx(auVar89,auVar129._0_16_);
      auVar78 = vhaddps_avx(auVar78,auVar89);
      auVar69 = vshufps_avx(auVar69,auVar69,0xe8);
      auVar78 = vshufps_avx(auVar78,auVar78,0xe8);
      auVar194._0_4_ = auVar69._0_4_ + auVar86._0_4_;
      auVar194._4_4_ = auVar69._4_4_ + auVar86._4_4_;
      auVar194._8_4_ = auVar69._8_4_ + auVar86._8_4_;
      auVar194._12_4_ = auVar69._12_4_ + auVar86._12_4_;
      auVar209._0_4_ = auVar78._0_4_ + auVar86._0_4_;
      auVar209._4_4_ = auVar78._4_4_ + auVar86._4_4_;
      auVar209._8_4_ = auVar78._8_4_ + auVar86._8_4_;
      auVar209._12_4_ = auVar78._12_4_ + auVar86._12_4_;
      auVar69 = vmaxps_avx(auVar79,auVar194);
      auVar78 = vminps_avx(auVar209,auVar88);
      uVar59 = vcmpps_avx512vl(auVar78,auVar69,1);
    } while ((uVar59 & 3) != 0);
    uVar59 = vcmpps_avx512vl(auVar209,auVar88,1);
    uVar23 = vcmpps_avx512vl(auVar74,auVar194,1);
    if (((ushort)uVar23 & (ushort)uVar59 & 1) == 0) {
      bVar51 = 0;
    }
    else {
      auVar69 = vmovshdup_avx(auVar194);
      bVar51 = auVar81._0_4_ < auVar69._0_4_ & (byte)(uVar59 >> 1) & 0x7f;
    }
    if (((3 < (uint)uVar53 || uVar7 != 0 && !bVar62) | bVar51) == 1) {
      lVar55 = 0xc9;
      do {
        lVar55 = lVar55 + -1;
        if (lVar55 == 0) goto LAB_01a000d2;
        auVar74 = vsubss_avx512f(auVar77,auVar86);
        fVar227 = auVar74._0_4_;
        fVar130 = fVar227 * fVar227 * fVar227;
        auVar74 = vmulss_avx512f(auVar86,ZEXT416(0x40400000));
        fVar218 = auVar74._0_4_ * fVar227 * fVar227;
        fVar228 = auVar86._0_4_;
        auVar74 = vmulss_avx512f(ZEXT416((uint)(fVar228 * fVar228)),ZEXT416(0x40400000));
        fVar227 = fVar227 * auVar74._0_4_;
        auVar156._4_4_ = fVar130;
        auVar156._0_4_ = fVar130;
        auVar156._8_4_ = fVar130;
        auVar156._12_4_ = fVar130;
        auVar149._4_4_ = fVar218;
        auVar149._0_4_ = fVar218;
        auVar149._8_4_ = fVar218;
        auVar149._12_4_ = fVar218;
        auVar132._4_4_ = fVar227;
        auVar132._0_4_ = fVar227;
        auVar132._8_4_ = fVar227;
        auVar132._12_4_ = fVar227;
        fVar228 = fVar228 * fVar228 * fVar228;
        auVar175._0_4_ = (float)local_490._0_4_ * fVar228;
        auVar175._4_4_ = (float)local_490._4_4_ * fVar228;
        auVar175._8_4_ = fStack_488 * fVar228;
        auVar175._12_4_ = fStack_484 * fVar228;
        auVar74 = vfmadd231ps_fma(auVar175,auVar71,auVar132);
        auVar74 = vfmadd231ps_fma(auVar74,auVar73,auVar149);
        auVar74 = vfmadd231ps_fma(auVar74,auVar3,auVar156);
        auVar133._8_8_ = auVar74._0_8_;
        auVar133._0_8_ = auVar74._0_8_;
        auVar74 = vshufpd_avx(auVar74,auVar74,3);
        auVar69 = vshufps_avx(auVar86,auVar86,0x55);
        auVar74 = vsubps_avx(auVar74,auVar133);
        auVar69 = vfmadd213ps_fma(auVar74,auVar69,auVar133);
        fVar130 = auVar69._0_4_;
        auVar74 = vshufps_avx(auVar69,auVar69,0x55);
        auVar134._0_4_ = auVar66._0_4_ * fVar130 + auVar90._0_4_ * auVar74._0_4_;
        auVar134._4_4_ = auVar66._4_4_ * fVar130 + auVar90._4_4_ * auVar74._4_4_;
        auVar134._8_4_ = auVar66._8_4_ * fVar130 + auVar90._8_4_ * auVar74._8_4_;
        auVar134._12_4_ = auVar66._12_4_ * fVar130 + auVar90._12_4_ * auVar74._12_4_;
        auVar86 = vsubps_avx(auVar86,auVar134);
        auVar74 = vandps_avx512vl(auVar69,auVar262._0_16_);
        auVar129._0_16_ = vprolq_avx512vl(auVar74,0x20);
        auVar74 = vmaxss_avx(auVar129._0_16_,auVar74);
        bVar62 = auVar74._0_4_ <= (float)local_4a0._0_4_;
      } while ((float)local_4a0._0_4_ <= auVar74._0_4_);
      auVar74 = vucomiss_avx512f(auVar85);
      if (bVar62) {
        auVar66 = vucomiss_avx512f(auVar74);
        auVar271 = ZEXT1664(auVar66);
        if (bVar62) {
          vmovshdup_avx(auVar74);
          auVar66 = vucomiss_avx512f(auVar85);
          if (bVar62) {
            auVar69 = vucomiss_avx512f(auVar66);
            auVar271 = ZEXT1664(auVar69);
            if (bVar62) {
              auVar77 = vinsertps_avx(ZEXT416((uint)pre->ray_space[k].vx.field_0.m128[2]),
                                      ZEXT416((uint)pre->ray_space[k].vy.field_0.m128[2]),0x1c);
              auVar87 = vinsertps_avx(auVar77,ZEXT416((uint)pre->ray_space[k].vz.field_0.m128[2]),
                                      0x28);
              auVar77 = vdpps_avx(auVar87,local_4b0,0x7f);
              auVar78 = vdpps_avx(auVar87,local_4c0,0x7f);
              auVar79 = vdpps_avx(auVar87,local_4d0,0x7f);
              auVar89 = vdpps_avx(auVar87,local_4e0,0x7f);
              auVar93 = vdpps_avx(auVar87,local_4f0,0x7f);
              auVar83 = vdpps_avx(auVar87,local_500,0x7f);
              auVar84 = vdpps_avx(auVar87,local_510,0x7f);
              auVar87 = vdpps_avx(auVar87,local_520,0x7f);
              auVar85 = vsubss_avx512f(auVar69,auVar66);
              fVar229 = auVar66._0_4_;
              auVar66 = vfmadd231ss_fma(ZEXT416((uint)(fVar229 * auVar93._0_4_)),auVar85,auVar77);
              auVar77 = vfmadd231ss_fma(ZEXT416((uint)(auVar83._0_4_ * fVar229)),auVar85,auVar78);
              auVar78 = vfmadd231ss_fma(ZEXT416((uint)(auVar84._0_4_ * fVar229)),auVar85,auVar79);
              auVar79 = vfmadd231ss_fma(ZEXT416((uint)(fVar229 * auVar87._0_4_)),auVar85,auVar89);
              auVar69 = vsubss_avx512f(auVar69,auVar74);
              auVar184._0_4_ = auVar69._0_4_;
              fVar218 = auVar184._0_4_ * auVar184._0_4_ * auVar184._0_4_;
              auVar69 = vmulss_avx512f(auVar74,ZEXT416(0x40400000));
              fVar227 = auVar69._0_4_ * auVar184._0_4_ * auVar184._0_4_;
              fVar130 = auVar74._0_4_;
              auVar176._0_4_ = fVar130 * fVar130;
              auVar176._4_4_ = auVar74._4_4_ * auVar74._4_4_;
              auVar176._8_4_ = auVar74._8_4_ * auVar74._8_4_;
              auVar176._12_4_ = auVar74._12_4_ * auVar74._12_4_;
              auVar129._0_16_ = vmulss_avx512f(auVar176,ZEXT416(0x40400000));
              fVar228 = auVar184._0_4_ * auVar129._0_4_;
              fVar241 = fVar130 * auVar176._0_4_;
              auVar69 = vfmadd231ss_fma(ZEXT416((uint)(fVar241 * auVar79._0_4_)),
                                        ZEXT416((uint)fVar228),auVar78);
              auVar69 = vfmadd231ss_fma(auVar69,ZEXT416((uint)fVar227),auVar77);
              auVar66 = vfmadd231ss_fma(auVar69,ZEXT416((uint)fVar218),auVar66);
              fVar240 = auVar66._0_4_;
              if ((fVar255 <= fVar240) &&
                 (fVar242 = *(float *)(ray + k * 4 + 0x200), fVar240 <= fVar242)) {
                auVar66 = vshufps_avx(auVar74,auVar74,0x55);
                auVar77 = vsubps_avx512vl(auVar80,auVar66);
                fVar243 = auVar66._0_4_;
                auVar214._0_4_ = fVar243 * (float)local_540._0_4_;
                fVar247 = auVar66._4_4_;
                auVar214._4_4_ = fVar247 * (float)local_540._4_4_;
                fVar248 = auVar66._8_4_;
                auVar214._8_4_ = fVar248 * fStack_538;
                fVar249 = auVar66._12_4_;
                auVar214._12_4_ = fVar249 * fStack_534;
                auVar226._0_4_ = fVar243 * (float)local_590._0_4_;
                auVar226._4_4_ = fVar247 * (float)local_590._4_4_;
                auVar226._8_4_ = fVar248 * fStack_588;
                auVar226._12_4_ = fVar249 * fStack_584;
                auVar238._0_4_ = fVar243 * (float)local_5a0._0_4_;
                auVar238._4_4_ = fVar247 * (float)local_5a0._4_4_;
                auVar238._8_4_ = fVar248 * fStack_598;
                auVar238._12_4_ = fVar249 * fStack_594;
                auVar195._0_4_ = fVar243 * (float)local_560._0_4_;
                auVar195._4_4_ = fVar247 * (float)local_560._4_4_;
                auVar195._8_4_ = fVar248 * fStack_558;
                auVar195._12_4_ = fVar249 * fStack_554;
                auVar66 = vfmadd231ps_fma(auVar214,auVar77,local_530);
                auVar69 = vfmadd231ps_fma(auVar226,auVar77,local_570);
                auVar80 = vfmadd231ps_fma(auVar238,auVar77,local_580);
                auVar77 = vfmadd231ps_fma(auVar195,auVar77,local_550);
                auVar66 = vsubps_avx(auVar69,auVar66);
                auVar69 = vsubps_avx(auVar80,auVar69);
                auVar80 = vsubps_avx(auVar77,auVar80);
                auVar239._0_4_ = fVar130 * auVar69._0_4_;
                auVar239._4_4_ = fVar130 * auVar69._4_4_;
                auVar239._8_4_ = fVar130 * auVar69._8_4_;
                auVar239._12_4_ = fVar130 * auVar69._12_4_;
                auVar184._4_4_ = auVar184._0_4_;
                auVar184._8_4_ = auVar184._0_4_;
                auVar184._12_4_ = auVar184._0_4_;
                auVar66 = vfmadd231ps_fma(auVar239,auVar184,auVar66);
                auVar196._0_4_ = fVar130 * auVar80._0_4_;
                auVar196._4_4_ = fVar130 * auVar80._4_4_;
                auVar196._8_4_ = fVar130 * auVar80._8_4_;
                auVar196._12_4_ = fVar130 * auVar80._12_4_;
                auVar69 = vfmadd231ps_fma(auVar196,auVar184,auVar69);
                auVar197._0_4_ = fVar130 * auVar69._0_4_;
                auVar197._4_4_ = fVar130 * auVar69._4_4_;
                auVar197._8_4_ = fVar130 * auVar69._8_4_;
                auVar197._12_4_ = fVar130 * auVar69._12_4_;
                auVar66 = vfmadd231ps_fma(auVar197,auVar184,auVar66);
                auVar27._8_4_ = 0x40400000;
                auVar27._0_8_ = 0x4040000040400000;
                auVar27._12_4_ = 0x40400000;
                auVar129._0_16_ = vmulps_avx512vl(auVar66,auVar27);
                pGVar8 = (context->scene->geometries).items[uVar5].ptr;
                if ((pGVar8->mask & *(uint *)(ray + k * 4 + 0x240)) != 0) {
                  auVar177._0_4_ = fVar241 * (float)local_5e0._0_4_;
                  auVar177._4_4_ = fVar241 * (float)local_5e0._4_4_;
                  auVar177._8_4_ = fVar241 * fStack_5d8;
                  auVar177._12_4_ = fVar241 * fStack_5d4;
                  auVar168._4_4_ = fVar228;
                  auVar168._0_4_ = fVar228;
                  auVar168._8_4_ = fVar228;
                  auVar168._12_4_ = fVar228;
                  auVar66 = vfmadd132ps_fma(auVar168,auVar177,local_5d0);
                  auVar157._4_4_ = fVar227;
                  auVar157._0_4_ = fVar227;
                  auVar157._8_4_ = fVar227;
                  auVar157._12_4_ = fVar227;
                  auVar66 = vfmadd132ps_fma(auVar157,auVar66,local_5c0);
                  auVar150._4_4_ = fVar218;
                  auVar150._0_4_ = fVar218;
                  auVar150._8_4_ = fVar218;
                  auVar150._12_4_ = fVar218;
                  auVar80 = vfmadd132ps_fma(auVar150,auVar66,local_5b0);
                  auVar66 = vshufps_avx(auVar80,auVar80,0xc9);
                  auVar69 = vshufps_avx(auVar129._0_16_,auVar129._0_16_,0xc9);
                  auVar151._0_4_ = auVar80._0_4_ * auVar69._0_4_;
                  auVar151._4_4_ = auVar80._4_4_ * auVar69._4_4_;
                  auVar151._8_4_ = auVar80._8_4_ * auVar69._8_4_;
                  auVar151._12_4_ = auVar80._12_4_ * auVar69._12_4_;
                  auVar66 = vfmsub231ps_fma(auVar151,auVar129._0_16_,auVar66);
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (pGVar8->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                    *(float *)(ray + k * 4 + 0x200) = fVar240;
                    uVar139 = vextractps_avx(auVar66,1);
                    *(undefined4 *)(ray + k * 4 + 0x300) = uVar139;
                    uVar139 = vextractps_avx(auVar66,2);
                    *(undefined4 *)(ray + k * 4 + 0x340) = uVar139;
                    *(int *)(ray + k * 4 + 0x380) = auVar66._0_4_;
                    *(float *)(ray + k * 4 + 0x3c0) = fVar130;
                    *(float *)(ray + k * 4 + 0x400) = fVar229;
                    *(uint *)(ray + k * 4 + 0x440) = uVar6;
                    *(uint *)(ray + k * 4 + 0x480) = uVar5;
                    *(uint *)(ray + k * 4 + 0x4c0) = context->user->instID[0];
                    *(uint *)(ray + k * 4 + 0x500) = context->user->instPrimID[0];
                    goto LAB_01a000d2;
                  }
                  local_200 = vbroadcastss_avx512f(auVar74);
                  auVar127 = vbroadcastss_avx512f(ZEXT416(1));
                  local_1c0 = vpermps_avx512f(auVar127,ZEXT1664(auVar74));
                  auVar127 = vpermps_avx512f(auVar127,ZEXT1664(auVar66));
                  auVar128 = vbroadcastss_avx512f(ZEXT416(2));
                  local_280 = vpermps_avx512f(auVar128,ZEXT1664(auVar66));
                  local_240 = vbroadcastss_avx512f(auVar66);
                  local_2c0[0] = (RTCHitN)auVar127[0];
                  local_2c0[1] = (RTCHitN)auVar127[1];
                  local_2c0[2] = (RTCHitN)auVar127[2];
                  local_2c0[3] = (RTCHitN)auVar127[3];
                  local_2c0[4] = (RTCHitN)auVar127[4];
                  local_2c0[5] = (RTCHitN)auVar127[5];
                  local_2c0[6] = (RTCHitN)auVar127[6];
                  local_2c0[7] = (RTCHitN)auVar127[7];
                  local_2c0[8] = (RTCHitN)auVar127[8];
                  local_2c0[9] = (RTCHitN)auVar127[9];
                  local_2c0[10] = (RTCHitN)auVar127[10];
                  local_2c0[0xb] = (RTCHitN)auVar127[0xb];
                  local_2c0[0xc] = (RTCHitN)auVar127[0xc];
                  local_2c0[0xd] = (RTCHitN)auVar127[0xd];
                  local_2c0[0xe] = (RTCHitN)auVar127[0xe];
                  local_2c0[0xf] = (RTCHitN)auVar127[0xf];
                  local_2c0[0x10] = (RTCHitN)auVar127[0x10];
                  local_2c0[0x11] = (RTCHitN)auVar127[0x11];
                  local_2c0[0x12] = (RTCHitN)auVar127[0x12];
                  local_2c0[0x13] = (RTCHitN)auVar127[0x13];
                  local_2c0[0x14] = (RTCHitN)auVar127[0x14];
                  local_2c0[0x15] = (RTCHitN)auVar127[0x15];
                  local_2c0[0x16] = (RTCHitN)auVar127[0x16];
                  local_2c0[0x17] = (RTCHitN)auVar127[0x17];
                  local_2c0[0x18] = (RTCHitN)auVar127[0x18];
                  local_2c0[0x19] = (RTCHitN)auVar127[0x19];
                  local_2c0[0x1a] = (RTCHitN)auVar127[0x1a];
                  local_2c0[0x1b] = (RTCHitN)auVar127[0x1b];
                  local_2c0[0x1c] = (RTCHitN)auVar127[0x1c];
                  local_2c0[0x1d] = (RTCHitN)auVar127[0x1d];
                  local_2c0[0x1e] = (RTCHitN)auVar127[0x1e];
                  local_2c0[0x1f] = (RTCHitN)auVar127[0x1f];
                  local_2c0[0x20] = (RTCHitN)auVar127[0x20];
                  local_2c0[0x21] = (RTCHitN)auVar127[0x21];
                  local_2c0[0x22] = (RTCHitN)auVar127[0x22];
                  local_2c0[0x23] = (RTCHitN)auVar127[0x23];
                  local_2c0[0x24] = (RTCHitN)auVar127[0x24];
                  local_2c0[0x25] = (RTCHitN)auVar127[0x25];
                  local_2c0[0x26] = (RTCHitN)auVar127[0x26];
                  local_2c0[0x27] = (RTCHitN)auVar127[0x27];
                  local_2c0[0x28] = (RTCHitN)auVar127[0x28];
                  local_2c0[0x29] = (RTCHitN)auVar127[0x29];
                  local_2c0[0x2a] = (RTCHitN)auVar127[0x2a];
                  local_2c0[0x2b] = (RTCHitN)auVar127[0x2b];
                  local_2c0[0x2c] = (RTCHitN)auVar127[0x2c];
                  local_2c0[0x2d] = (RTCHitN)auVar127[0x2d];
                  local_2c0[0x2e] = (RTCHitN)auVar127[0x2e];
                  local_2c0[0x2f] = (RTCHitN)auVar127[0x2f];
                  local_2c0[0x30] = (RTCHitN)auVar127[0x30];
                  local_2c0[0x31] = (RTCHitN)auVar127[0x31];
                  local_2c0[0x32] = (RTCHitN)auVar127[0x32];
                  local_2c0[0x33] = (RTCHitN)auVar127[0x33];
                  local_2c0[0x34] = (RTCHitN)auVar127[0x34];
                  local_2c0[0x35] = (RTCHitN)auVar127[0x35];
                  local_2c0[0x36] = (RTCHitN)auVar127[0x36];
                  local_2c0[0x37] = (RTCHitN)auVar127[0x37];
                  local_2c0[0x38] = (RTCHitN)auVar127[0x38];
                  local_2c0[0x39] = (RTCHitN)auVar127[0x39];
                  local_2c0[0x3a] = (RTCHitN)auVar127[0x3a];
                  local_2c0[0x3b] = (RTCHitN)auVar127[0x3b];
                  local_2c0[0x3c] = (RTCHitN)auVar127[0x3c];
                  local_2c0[0x3d] = (RTCHitN)auVar127[0x3d];
                  local_2c0[0x3e] = (RTCHitN)auVar127[0x3e];
                  local_2c0[0x3f] = (RTCHitN)auVar127[0x3f];
                  local_180 = local_340._0_8_;
                  uStack_178 = local_340._8_8_;
                  uStack_170 = local_340._16_8_;
                  uStack_168 = local_340._24_8_;
                  uStack_160 = local_340._32_8_;
                  uStack_158 = local_340._40_8_;
                  uStack_150 = local_340._48_8_;
                  uStack_148 = local_340._56_8_;
                  auVar127 = vmovdqa64_avx512f(local_300);
                  local_140 = vmovdqa64_avx512f(auVar127);
                  vpcmpeqd_avx2(auVar127._0_32_,auVar127._0_32_);
                  local_100 = vbroadcastss_avx512f(ZEXT416(context->user->instID[0]));
                  local_c0 = vbroadcastss_avx512f(ZEXT416(context->user->instPrimID[0]));
                  *(float *)(ray + k * 4 + 0x200) = fVar240;
                  auVar129 = vmovdqa64_avx512f(local_380);
                  local_400 = vmovdqa64_avx512f(auVar129);
                  local_620.valid = (int *)local_400;
                  local_620.geometryUserPtr = pGVar8->userPtr;
                  local_620.context = context->user;
                  local_620.hit = local_2c0;
                  local_620.N = 0x10;
                  local_620.ray = (RTCRayN *)ray;
                  if (pGVar8->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                    (*pGVar8->intersectionFilterN)(&local_620);
                    auVar271 = ZEXT464(0x3f800000);
                    auVar267 = ZEXT3264(_DAT_01fb9fe0);
                    auVar74 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                    auVar266 = ZEXT1664(auVar74);
                    auVar74 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
                    auVar265 = ZEXT1664(auVar74);
                    auVar99 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                    auVar264 = ZEXT3264(auVar99);
                    auVar74 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                    auVar263 = ZEXT1664(auVar74);
                    auVar74 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                    auVar262 = ZEXT1664(auVar74);
                    auVar74 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
                    auVar135 = ZEXT1664(auVar74);
                    auVar99 = vbroadcastss_avx512vl(ZEXT416(2));
                    auVar268 = ZEXT3264(auVar99);
                    auVar129 = vmovdqa64_avx512f(local_400);
                  }
                  uVar23 = vptestmd_avx512f(auVar129,auVar129);
                  if ((short)uVar23 != 0) {
                    p_Var9 = context->args->filter;
                    if ((p_Var9 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar8->field_8).field_0x2 & 0x40) != 0)))) {
                      (*p_Var9)(&local_620);
                      auVar271 = ZEXT464(0x3f800000);
                      auVar267 = ZEXT3264(_DAT_01fb9fe0);
                      auVar74 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                      auVar266 = ZEXT1664(auVar74);
                      auVar74 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
                      auVar265 = ZEXT1664(auVar74);
                      auVar99 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                      auVar264 = ZEXT3264(auVar99);
                      auVar74 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                      auVar263 = ZEXT1664(auVar74);
                      auVar74 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                      auVar262 = ZEXT1664(auVar74);
                      auVar74 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
                      auVar135 = ZEXT1664(auVar74);
                      auVar99 = vbroadcastss_avx512vl(ZEXT416(2));
                      auVar268 = ZEXT3264(auVar99);
                      auVar129 = vmovdqa64_avx512f(local_400);
                    }
                    uVar59 = vptestmd_avx512f(auVar129,auVar129);
                    if ((short)uVar59 != 0) {
                      iVar36 = *(int *)(local_620.hit + 4);
                      iVar37 = *(int *)(local_620.hit + 8);
                      iVar38 = *(int *)(local_620.hit + 0xc);
                      iVar39 = *(int *)(local_620.hit + 0x10);
                      iVar40 = *(int *)(local_620.hit + 0x14);
                      iVar41 = *(int *)(local_620.hit + 0x18);
                      iVar42 = *(int *)(local_620.hit + 0x1c);
                      iVar43 = *(int *)(local_620.hit + 0x20);
                      iVar44 = *(int *)(local_620.hit + 0x24);
                      iVar45 = *(int *)(local_620.hit + 0x28);
                      iVar46 = *(int *)(local_620.hit + 0x2c);
                      iVar47 = *(int *)(local_620.hit + 0x30);
                      iVar48 = *(int *)(local_620.hit + 0x34);
                      iVar49 = *(int *)(local_620.hit + 0x38);
                      iVar50 = *(int *)(local_620.hit + 0x3c);
                      bVar51 = (byte)uVar59;
                      bVar62 = (bool)((byte)(uVar59 >> 1) & 1);
                      bVar63 = (bool)((byte)(uVar59 >> 2) & 1);
                      bVar60 = (bool)((byte)(uVar59 >> 3) & 1);
                      bVar61 = (bool)((byte)(uVar59 >> 4) & 1);
                      bVar12 = (bool)((byte)(uVar59 >> 5) & 1);
                      bVar13 = (bool)((byte)(uVar59 >> 6) & 1);
                      bVar14 = (bool)((byte)(uVar59 >> 7) & 1);
                      bVar15 = (byte)(uVar59 >> 8);
                      bVar16 = (bool)((byte)(uVar59 >> 9) & 1);
                      bVar17 = (bool)((byte)(uVar59 >> 10) & 1);
                      bVar18 = (bool)((byte)(uVar59 >> 0xb) & 1);
                      bVar19 = (bool)((byte)(uVar59 >> 0xc) & 1);
                      bVar20 = (bool)((byte)(uVar59 >> 0xd) & 1);
                      bVar21 = (bool)((byte)(uVar59 >> 0xe) & 1);
                      bVar22 = SUB81(uVar59 >> 0xf,0);
                      *(uint *)(local_620.ray + 0x300) =
                           (uint)(bVar51 & 1) * *(int *)local_620.hit |
                           (uint)!(bool)(bVar51 & 1) * *(int *)(local_620.ray + 0x300);
                      *(uint *)(local_620.ray + 0x304) =
                           (uint)bVar62 * iVar36 | (uint)!bVar62 * *(int *)(local_620.ray + 0x304);
                      *(uint *)(local_620.ray + 0x308) =
                           (uint)bVar63 * iVar37 | (uint)!bVar63 * *(int *)(local_620.ray + 0x308);
                      *(uint *)(local_620.ray + 0x30c) =
                           (uint)bVar60 * iVar38 | (uint)!bVar60 * *(int *)(local_620.ray + 0x30c);
                      *(uint *)(local_620.ray + 0x310) =
                           (uint)bVar61 * iVar39 | (uint)!bVar61 * *(int *)(local_620.ray + 0x310);
                      *(uint *)(local_620.ray + 0x314) =
                           (uint)bVar12 * iVar40 | (uint)!bVar12 * *(int *)(local_620.ray + 0x314);
                      *(uint *)(local_620.ray + 0x318) =
                           (uint)bVar13 * iVar41 | (uint)!bVar13 * *(int *)(local_620.ray + 0x318);
                      *(uint *)(local_620.ray + 0x31c) =
                           (uint)bVar14 * iVar42 | (uint)!bVar14 * *(int *)(local_620.ray + 0x31c);
                      *(uint *)(local_620.ray + 800) =
                           (uint)(bVar15 & 1) * iVar43 |
                           (uint)!(bool)(bVar15 & 1) * *(int *)(local_620.ray + 800);
                      *(uint *)(local_620.ray + 0x324) =
                           (uint)bVar16 * iVar44 | (uint)!bVar16 * *(int *)(local_620.ray + 0x324);
                      *(uint *)(local_620.ray + 0x328) =
                           (uint)bVar17 * iVar45 | (uint)!bVar17 * *(int *)(local_620.ray + 0x328);
                      *(uint *)(local_620.ray + 0x32c) =
                           (uint)bVar18 * iVar46 | (uint)!bVar18 * *(int *)(local_620.ray + 0x32c);
                      *(uint *)(local_620.ray + 0x330) =
                           (uint)bVar19 * iVar47 | (uint)!bVar19 * *(int *)(local_620.ray + 0x330);
                      *(uint *)(local_620.ray + 0x334) =
                           (uint)bVar20 * iVar48 | (uint)!bVar20 * *(int *)(local_620.ray + 0x334);
                      *(uint *)(local_620.ray + 0x338) =
                           (uint)bVar21 * iVar49 | (uint)!bVar21 * *(int *)(local_620.ray + 0x338);
                      *(uint *)(local_620.ray + 0x33c) =
                           (uint)bVar22 * iVar50 | (uint)!bVar22 * *(int *)(local_620.ray + 0x33c);
                      iVar36 = *(int *)(local_620.hit + 0x44);
                      iVar37 = *(int *)(local_620.hit + 0x48);
                      iVar38 = *(int *)(local_620.hit + 0x4c);
                      iVar39 = *(int *)(local_620.hit + 0x50);
                      iVar40 = *(int *)(local_620.hit + 0x54);
                      iVar41 = *(int *)(local_620.hit + 0x58);
                      iVar42 = *(int *)(local_620.hit + 0x5c);
                      iVar43 = *(int *)(local_620.hit + 0x60);
                      iVar44 = *(int *)(local_620.hit + 100);
                      iVar45 = *(int *)(local_620.hit + 0x68);
                      iVar46 = *(int *)(local_620.hit + 0x6c);
                      iVar47 = *(int *)(local_620.hit + 0x70);
                      iVar48 = *(int *)(local_620.hit + 0x74);
                      iVar49 = *(int *)(local_620.hit + 0x78);
                      iVar50 = *(int *)(local_620.hit + 0x7c);
                      bVar62 = (bool)((byte)(uVar59 >> 1) & 1);
                      bVar63 = (bool)((byte)(uVar59 >> 2) & 1);
                      bVar60 = (bool)((byte)(uVar59 >> 3) & 1);
                      bVar61 = (bool)((byte)(uVar59 >> 4) & 1);
                      bVar12 = (bool)((byte)(uVar59 >> 5) & 1);
                      bVar13 = (bool)((byte)(uVar59 >> 6) & 1);
                      bVar14 = (bool)((byte)(uVar59 >> 7) & 1);
                      bVar16 = (bool)((byte)(uVar59 >> 9) & 1);
                      bVar17 = (bool)((byte)(uVar59 >> 10) & 1);
                      bVar18 = (bool)((byte)(uVar59 >> 0xb) & 1);
                      bVar19 = (bool)((byte)(uVar59 >> 0xc) & 1);
                      bVar20 = (bool)((byte)(uVar59 >> 0xd) & 1);
                      bVar21 = (bool)((byte)(uVar59 >> 0xe) & 1);
                      bVar22 = SUB81(uVar59 >> 0xf,0);
                      *(uint *)(local_620.ray + 0x340) =
                           (uint)(bVar51 & 1) * *(int *)(local_620.hit + 0x40) |
                           (uint)!(bool)(bVar51 & 1) * *(int *)(local_620.ray + 0x340);
                      *(uint *)(local_620.ray + 0x344) =
                           (uint)bVar62 * iVar36 | (uint)!bVar62 * *(int *)(local_620.ray + 0x344);
                      *(uint *)(local_620.ray + 0x348) =
                           (uint)bVar63 * iVar37 | (uint)!bVar63 * *(int *)(local_620.ray + 0x348);
                      *(uint *)(local_620.ray + 0x34c) =
                           (uint)bVar60 * iVar38 | (uint)!bVar60 * *(int *)(local_620.ray + 0x34c);
                      *(uint *)(local_620.ray + 0x350) =
                           (uint)bVar61 * iVar39 | (uint)!bVar61 * *(int *)(local_620.ray + 0x350);
                      *(uint *)(local_620.ray + 0x354) =
                           (uint)bVar12 * iVar40 | (uint)!bVar12 * *(int *)(local_620.ray + 0x354);
                      *(uint *)(local_620.ray + 0x358) =
                           (uint)bVar13 * iVar41 | (uint)!bVar13 * *(int *)(local_620.ray + 0x358);
                      *(uint *)(local_620.ray + 0x35c) =
                           (uint)bVar14 * iVar42 | (uint)!bVar14 * *(int *)(local_620.ray + 0x35c);
                      *(uint *)(local_620.ray + 0x360) =
                           (uint)(bVar15 & 1) * iVar43 |
                           (uint)!(bool)(bVar15 & 1) * *(int *)(local_620.ray + 0x360);
                      *(uint *)(local_620.ray + 0x364) =
                           (uint)bVar16 * iVar44 | (uint)!bVar16 * *(int *)(local_620.ray + 0x364);
                      *(uint *)(local_620.ray + 0x368) =
                           (uint)bVar17 * iVar45 | (uint)!bVar17 * *(int *)(local_620.ray + 0x368);
                      *(uint *)(local_620.ray + 0x36c) =
                           (uint)bVar18 * iVar46 | (uint)!bVar18 * *(int *)(local_620.ray + 0x36c);
                      *(uint *)(local_620.ray + 0x370) =
                           (uint)bVar19 * iVar47 | (uint)!bVar19 * *(int *)(local_620.ray + 0x370);
                      *(uint *)(local_620.ray + 0x374) =
                           (uint)bVar20 * iVar48 | (uint)!bVar20 * *(int *)(local_620.ray + 0x374);
                      *(uint *)(local_620.ray + 0x378) =
                           (uint)bVar21 * iVar49 | (uint)!bVar21 * *(int *)(local_620.ray + 0x378);
                      *(uint *)(local_620.ray + 0x37c) =
                           (uint)bVar22 * iVar50 | (uint)!bVar22 * *(int *)(local_620.ray + 0x37c);
                      iVar36 = *(int *)(local_620.hit + 0x84);
                      iVar37 = *(int *)(local_620.hit + 0x88);
                      iVar38 = *(int *)(local_620.hit + 0x8c);
                      iVar39 = *(int *)(local_620.hit + 0x90);
                      iVar40 = *(int *)(local_620.hit + 0x94);
                      iVar41 = *(int *)(local_620.hit + 0x98);
                      iVar42 = *(int *)(local_620.hit + 0x9c);
                      iVar43 = *(int *)(local_620.hit + 0xa0);
                      iVar44 = *(int *)(local_620.hit + 0xa4);
                      iVar45 = *(int *)(local_620.hit + 0xa8);
                      iVar46 = *(int *)(local_620.hit + 0xac);
                      iVar47 = *(int *)(local_620.hit + 0xb0);
                      iVar48 = *(int *)(local_620.hit + 0xb4);
                      iVar49 = *(int *)(local_620.hit + 0xb8);
                      iVar50 = *(int *)(local_620.hit + 0xbc);
                      bVar62 = (bool)((byte)(uVar59 >> 1) & 1);
                      bVar63 = (bool)((byte)(uVar59 >> 2) & 1);
                      bVar60 = (bool)((byte)(uVar59 >> 3) & 1);
                      bVar61 = (bool)((byte)(uVar59 >> 4) & 1);
                      bVar12 = (bool)((byte)(uVar59 >> 5) & 1);
                      bVar13 = (bool)((byte)(uVar59 >> 6) & 1);
                      bVar14 = (bool)((byte)(uVar59 >> 7) & 1);
                      bVar16 = (bool)((byte)(uVar59 >> 9) & 1);
                      bVar17 = (bool)((byte)(uVar59 >> 10) & 1);
                      bVar18 = (bool)((byte)(uVar59 >> 0xb) & 1);
                      bVar19 = (bool)((byte)(uVar59 >> 0xc) & 1);
                      bVar20 = (bool)((byte)(uVar59 >> 0xd) & 1);
                      bVar21 = (bool)((byte)(uVar59 >> 0xe) & 1);
                      bVar22 = SUB81(uVar59 >> 0xf,0);
                      *(uint *)(local_620.ray + 0x380) =
                           (uint)(bVar51 & 1) * *(int *)(local_620.hit + 0x80) |
                           (uint)!(bool)(bVar51 & 1) * *(int *)(local_620.ray + 0x380);
                      *(uint *)(local_620.ray + 900) =
                           (uint)bVar62 * iVar36 | (uint)!bVar62 * *(int *)(local_620.ray + 900);
                      *(uint *)(local_620.ray + 0x388) =
                           (uint)bVar63 * iVar37 | (uint)!bVar63 * *(int *)(local_620.ray + 0x388);
                      *(uint *)(local_620.ray + 0x38c) =
                           (uint)bVar60 * iVar38 | (uint)!bVar60 * *(int *)(local_620.ray + 0x38c);
                      *(uint *)(local_620.ray + 0x390) =
                           (uint)bVar61 * iVar39 | (uint)!bVar61 * *(int *)(local_620.ray + 0x390);
                      *(uint *)(local_620.ray + 0x394) =
                           (uint)bVar12 * iVar40 | (uint)!bVar12 * *(int *)(local_620.ray + 0x394);
                      *(uint *)(local_620.ray + 0x398) =
                           (uint)bVar13 * iVar41 | (uint)!bVar13 * *(int *)(local_620.ray + 0x398);
                      *(uint *)(local_620.ray + 0x39c) =
                           (uint)bVar14 * iVar42 | (uint)!bVar14 * *(int *)(local_620.ray + 0x39c);
                      *(uint *)(local_620.ray + 0x3a0) =
                           (uint)(bVar15 & 1) * iVar43 |
                           (uint)!(bool)(bVar15 & 1) * *(int *)(local_620.ray + 0x3a0);
                      *(uint *)(local_620.ray + 0x3a4) =
                           (uint)bVar16 * iVar44 | (uint)!bVar16 * *(int *)(local_620.ray + 0x3a4);
                      *(uint *)(local_620.ray + 0x3a8) =
                           (uint)bVar17 * iVar45 | (uint)!bVar17 * *(int *)(local_620.ray + 0x3a8);
                      *(uint *)(local_620.ray + 0x3ac) =
                           (uint)bVar18 * iVar46 | (uint)!bVar18 * *(int *)(local_620.ray + 0x3ac);
                      *(uint *)(local_620.ray + 0x3b0) =
                           (uint)bVar19 * iVar47 | (uint)!bVar19 * *(int *)(local_620.ray + 0x3b0);
                      *(uint *)(local_620.ray + 0x3b4) =
                           (uint)bVar20 * iVar48 | (uint)!bVar20 * *(int *)(local_620.ray + 0x3b4);
                      *(uint *)(local_620.ray + 0x3b8) =
                           (uint)bVar21 * iVar49 | (uint)!bVar21 * *(int *)(local_620.ray + 0x3b8);
                      *(uint *)(local_620.ray + 0x3bc) =
                           (uint)bVar22 * iVar50 | (uint)!bVar22 * *(int *)(local_620.ray + 0x3bc);
                      iVar36 = *(int *)(local_620.hit + 0xc4);
                      iVar37 = *(int *)(local_620.hit + 200);
                      iVar38 = *(int *)(local_620.hit + 0xcc);
                      iVar39 = *(int *)(local_620.hit + 0xd0);
                      iVar40 = *(int *)(local_620.hit + 0xd4);
                      iVar41 = *(int *)(local_620.hit + 0xd8);
                      iVar42 = *(int *)(local_620.hit + 0xdc);
                      iVar43 = *(int *)(local_620.hit + 0xe0);
                      iVar44 = *(int *)(local_620.hit + 0xe4);
                      iVar45 = *(int *)(local_620.hit + 0xe8);
                      iVar46 = *(int *)(local_620.hit + 0xec);
                      iVar47 = *(int *)(local_620.hit + 0xf0);
                      iVar48 = *(int *)(local_620.hit + 0xf4);
                      iVar49 = *(int *)(local_620.hit + 0xf8);
                      iVar50 = *(int *)(local_620.hit + 0xfc);
                      bVar62 = (bool)((byte)(uVar59 >> 1) & 1);
                      bVar63 = (bool)((byte)(uVar59 >> 2) & 1);
                      bVar60 = (bool)((byte)(uVar59 >> 3) & 1);
                      bVar61 = (bool)((byte)(uVar59 >> 4) & 1);
                      bVar12 = (bool)((byte)(uVar59 >> 5) & 1);
                      bVar13 = (bool)((byte)(uVar59 >> 6) & 1);
                      bVar14 = (bool)((byte)(uVar59 >> 7) & 1);
                      bVar16 = (bool)((byte)(uVar59 >> 9) & 1);
                      bVar17 = (bool)((byte)(uVar59 >> 10) & 1);
                      bVar18 = (bool)((byte)(uVar59 >> 0xb) & 1);
                      bVar19 = (bool)((byte)(uVar59 >> 0xc) & 1);
                      bVar20 = (bool)((byte)(uVar59 >> 0xd) & 1);
                      bVar21 = (bool)((byte)(uVar59 >> 0xe) & 1);
                      bVar22 = SUB81(uVar59 >> 0xf,0);
                      *(uint *)(local_620.ray + 0x3c0) =
                           (uint)(bVar51 & 1) * *(int *)(local_620.hit + 0xc0) |
                           (uint)!(bool)(bVar51 & 1) * *(int *)(local_620.ray + 0x3c0);
                      *(uint *)(local_620.ray + 0x3c4) =
                           (uint)bVar62 * iVar36 | (uint)!bVar62 * *(int *)(local_620.ray + 0x3c4);
                      *(uint *)(local_620.ray + 0x3c8) =
                           (uint)bVar63 * iVar37 | (uint)!bVar63 * *(int *)(local_620.ray + 0x3c8);
                      *(uint *)(local_620.ray + 0x3cc) =
                           (uint)bVar60 * iVar38 | (uint)!bVar60 * *(int *)(local_620.ray + 0x3cc);
                      *(uint *)(local_620.ray + 0x3d0) =
                           (uint)bVar61 * iVar39 | (uint)!bVar61 * *(int *)(local_620.ray + 0x3d0);
                      *(uint *)(local_620.ray + 0x3d4) =
                           (uint)bVar12 * iVar40 | (uint)!bVar12 * *(int *)(local_620.ray + 0x3d4);
                      *(uint *)(local_620.ray + 0x3d8) =
                           (uint)bVar13 * iVar41 | (uint)!bVar13 * *(int *)(local_620.ray + 0x3d8);
                      *(uint *)(local_620.ray + 0x3dc) =
                           (uint)bVar14 * iVar42 | (uint)!bVar14 * *(int *)(local_620.ray + 0x3dc);
                      *(uint *)(local_620.ray + 0x3e0) =
                           (uint)(bVar15 & 1) * iVar43 |
                           (uint)!(bool)(bVar15 & 1) * *(int *)(local_620.ray + 0x3e0);
                      *(uint *)(local_620.ray + 0x3e4) =
                           (uint)bVar16 * iVar44 | (uint)!bVar16 * *(int *)(local_620.ray + 0x3e4);
                      *(uint *)(local_620.ray + 1000) =
                           (uint)bVar17 * iVar45 | (uint)!bVar17 * *(int *)(local_620.ray + 1000);
                      *(uint *)(local_620.ray + 0x3ec) =
                           (uint)bVar18 * iVar46 | (uint)!bVar18 * *(int *)(local_620.ray + 0x3ec);
                      *(uint *)(local_620.ray + 0x3f0) =
                           (uint)bVar19 * iVar47 | (uint)!bVar19 * *(int *)(local_620.ray + 0x3f0);
                      *(uint *)(local_620.ray + 0x3f4) =
                           (uint)bVar20 * iVar48 | (uint)!bVar20 * *(int *)(local_620.ray + 0x3f4);
                      *(uint *)(local_620.ray + 0x3f8) =
                           (uint)bVar21 * iVar49 | (uint)!bVar21 * *(int *)(local_620.ray + 0x3f8);
                      *(uint *)(local_620.ray + 0x3fc) =
                           (uint)bVar22 * iVar50 | (uint)!bVar22 * *(int *)(local_620.ray + 0x3fc);
                      iVar36 = *(int *)(local_620.hit + 0x104);
                      iVar37 = *(int *)(local_620.hit + 0x108);
                      iVar38 = *(int *)(local_620.hit + 0x10c);
                      iVar39 = *(int *)(local_620.hit + 0x110);
                      iVar40 = *(int *)(local_620.hit + 0x114);
                      iVar41 = *(int *)(local_620.hit + 0x118);
                      iVar42 = *(int *)(local_620.hit + 0x11c);
                      iVar43 = *(int *)(local_620.hit + 0x120);
                      iVar44 = *(int *)(local_620.hit + 0x124);
                      iVar45 = *(int *)(local_620.hit + 0x128);
                      iVar46 = *(int *)(local_620.hit + 300);
                      iVar47 = *(int *)(local_620.hit + 0x130);
                      iVar48 = *(int *)(local_620.hit + 0x134);
                      iVar49 = *(int *)(local_620.hit + 0x138);
                      iVar50 = *(int *)(local_620.hit + 0x13c);
                      bVar62 = (bool)((byte)(uVar59 >> 1) & 1);
                      bVar63 = (bool)((byte)(uVar59 >> 2) & 1);
                      bVar60 = (bool)((byte)(uVar59 >> 3) & 1);
                      bVar61 = (bool)((byte)(uVar59 >> 4) & 1);
                      bVar12 = (bool)((byte)(uVar59 >> 5) & 1);
                      bVar13 = (bool)((byte)(uVar59 >> 6) & 1);
                      bVar14 = (bool)((byte)(uVar59 >> 7) & 1);
                      bVar16 = (bool)((byte)(uVar59 >> 9) & 1);
                      bVar17 = (bool)((byte)(uVar59 >> 10) & 1);
                      bVar18 = (bool)((byte)(uVar59 >> 0xb) & 1);
                      bVar19 = (bool)((byte)(uVar59 >> 0xc) & 1);
                      bVar20 = (bool)((byte)(uVar59 >> 0xd) & 1);
                      bVar21 = (bool)((byte)(uVar59 >> 0xe) & 1);
                      bVar22 = SUB81(uVar59 >> 0xf,0);
                      *(uint *)(local_620.ray + 0x400) =
                           (uint)(bVar51 & 1) * *(int *)(local_620.hit + 0x100) |
                           (uint)!(bool)(bVar51 & 1) * *(int *)(local_620.ray + 0x400);
                      *(uint *)(local_620.ray + 0x404) =
                           (uint)bVar62 * iVar36 | (uint)!bVar62 * *(int *)(local_620.ray + 0x404);
                      *(uint *)(local_620.ray + 0x408) =
                           (uint)bVar63 * iVar37 | (uint)!bVar63 * *(int *)(local_620.ray + 0x408);
                      *(uint *)(local_620.ray + 0x40c) =
                           (uint)bVar60 * iVar38 | (uint)!bVar60 * *(int *)(local_620.ray + 0x40c);
                      *(uint *)(local_620.ray + 0x410) =
                           (uint)bVar61 * iVar39 | (uint)!bVar61 * *(int *)(local_620.ray + 0x410);
                      *(uint *)(local_620.ray + 0x414) =
                           (uint)bVar12 * iVar40 | (uint)!bVar12 * *(int *)(local_620.ray + 0x414);
                      *(uint *)(local_620.ray + 0x418) =
                           (uint)bVar13 * iVar41 | (uint)!bVar13 * *(int *)(local_620.ray + 0x418);
                      *(uint *)(local_620.ray + 0x41c) =
                           (uint)bVar14 * iVar42 | (uint)!bVar14 * *(int *)(local_620.ray + 0x41c);
                      *(uint *)(local_620.ray + 0x420) =
                           (uint)(bVar15 & 1) * iVar43 |
                           (uint)!(bool)(bVar15 & 1) * *(int *)(local_620.ray + 0x420);
                      *(uint *)(local_620.ray + 0x424) =
                           (uint)bVar16 * iVar44 | (uint)!bVar16 * *(int *)(local_620.ray + 0x424);
                      *(uint *)(local_620.ray + 0x428) =
                           (uint)bVar17 * iVar45 | (uint)!bVar17 * *(int *)(local_620.ray + 0x428);
                      *(uint *)(local_620.ray + 0x42c) =
                           (uint)bVar18 * iVar46 | (uint)!bVar18 * *(int *)(local_620.ray + 0x42c);
                      *(uint *)(local_620.ray + 0x430) =
                           (uint)bVar19 * iVar47 | (uint)!bVar19 * *(int *)(local_620.ray + 0x430);
                      *(uint *)(local_620.ray + 0x434) =
                           (uint)bVar20 * iVar48 | (uint)!bVar20 * *(int *)(local_620.ray + 0x434);
                      *(uint *)(local_620.ray + 0x438) =
                           (uint)bVar21 * iVar49 | (uint)!bVar21 * *(int *)(local_620.ray + 0x438);
                      *(uint *)(local_620.ray + 0x43c) =
                           (uint)bVar22 * iVar50 | (uint)!bVar22 * *(int *)(local_620.ray + 0x43c);
                      auVar127 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_620.hit + 0x140));
                      auVar127 = vmovdqu32_avx512f(auVar127);
                      *(undefined1 (*) [64])(local_620.ray + 0x440) = auVar127;
                      auVar127 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_620.hit + 0x180));
                      auVar127 = vmovdqu32_avx512f(auVar127);
                      *(undefined1 (*) [64])(local_620.ray + 0x480) = auVar127;
                      auVar128 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_620.hit + 0x1c0));
                      auVar127 = vmovdqa32_avx512f(auVar128);
                      *(undefined1 (*) [64])(local_620.ray + 0x4c0) = auVar127;
                      auVar127 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_620.hit + 0x200));
                      bVar62 = (bool)((byte)(uVar59 >> 1) & 1);
                      auVar35._4_56_ = auVar127._8_56_;
                      auVar35._0_4_ = (uint)bVar62 * auVar127._4_4_ | (uint)!bVar62 * auVar128._4_4_
                      ;
                      auVar129._0_8_ = auVar35._0_8_ << 0x20;
                      bVar62 = (bool)((byte)(uVar59 >> 2) & 1);
                      auVar129._8_4_ =
                           (uint)bVar62 * auVar127._8_4_ | (uint)!bVar62 * auVar128._8_4_;
                      bVar62 = (bool)((byte)(uVar59 >> 3) & 1);
                      auVar129._12_4_ =
                           (uint)bVar62 * auVar127._12_4_ | (uint)!bVar62 * auVar128._12_4_;
                      bVar62 = (bool)((byte)(uVar59 >> 4) & 1);
                      auVar129._16_4_ =
                           (uint)bVar62 * auVar127._16_4_ | (uint)!bVar62 * auVar128._16_4_;
                      bVar62 = (bool)((byte)(uVar59 >> 5) & 1);
                      auVar129._20_4_ =
                           (uint)bVar62 * auVar127._20_4_ | (uint)!bVar62 * auVar128._20_4_;
                      bVar62 = (bool)((byte)(uVar59 >> 6) & 1);
                      auVar129._24_4_ =
                           (uint)bVar62 * auVar127._24_4_ | (uint)!bVar62 * auVar128._24_4_;
                      bVar62 = (bool)((byte)(uVar59 >> 7) & 1);
                      auVar129._28_4_ =
                           (uint)bVar62 * auVar127._28_4_ | (uint)!bVar62 * auVar128._28_4_;
                      auVar129._32_4_ =
                           (uint)(bVar15 & 1) * auVar127._32_4_ |
                           (uint)!(bool)(bVar15 & 1) * auVar128._32_4_;
                      bVar62 = (bool)((byte)(uVar59 >> 9) & 1);
                      auVar129._36_4_ =
                           (uint)bVar62 * auVar127._36_4_ | (uint)!bVar62 * auVar128._36_4_;
                      bVar62 = (bool)((byte)(uVar59 >> 10) & 1);
                      auVar129._40_4_ =
                           (uint)bVar62 * auVar127._40_4_ | (uint)!bVar62 * auVar128._40_4_;
                      bVar62 = (bool)((byte)(uVar59 >> 0xb) & 1);
                      auVar129._44_4_ =
                           (uint)bVar62 * auVar127._44_4_ | (uint)!bVar62 * auVar128._44_4_;
                      bVar62 = (bool)((byte)(uVar59 >> 0xc) & 1);
                      auVar129._48_4_ =
                           (uint)bVar62 * auVar127._48_4_ | (uint)!bVar62 * auVar128._48_4_;
                      bVar62 = (bool)((byte)(uVar59 >> 0xd) & 1);
                      auVar129._52_4_ =
                           (uint)bVar62 * auVar127._52_4_ | (uint)!bVar62 * auVar128._52_4_;
                      bVar62 = (bool)((byte)(uVar59 >> 0xe) & 1);
                      auVar129._56_4_ =
                           (uint)bVar62 * auVar127._56_4_ | (uint)!bVar62 * auVar128._56_4_;
                      bVar62 = SUB81(uVar59 >> 0xf,0);
                      auVar129._60_4_ =
                           (uint)bVar62 * auVar127._60_4_ | (uint)!bVar62 * auVar128._60_4_;
                      auVar127 = vmovdqa32_avx512f(auVar127);
                      *(undefined1 (*) [64])(local_620.ray + 0x500) = auVar127;
                      goto LAB_01a000d2;
                    }
                  }
                  *(float *)(ray + k * 4 + 0x200) = fVar242;
                }
              }
            }
          }
        }
      }
      goto LAB_01a000d2;
    }
    auVar66 = vinsertps_avx(auVar81,auVar82,0x10);
  } while( true );
}

Assistant:

static __forceinline void intersect_n(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);

          unsigned int vertexID = geom->curve(primID);
          Vec3ff a0,a1,a2,a3; Vec3fa n0,n1,n2,n3; geom->gather(a0,a1,a2,a3,n0,n1,n2,n3,vertexID);

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }

          Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,n0,n1,n2,n3,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }